

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# innerproduct_x86.cpp
# Opt level: O3

int __thiscall
ncnn::InnerProduct_x86::forward(InnerProduct_x86 *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  ulong uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  float fVar8;
  uint uVar9;
  int iVar10;
  void *pvVar11;
  void *pvVar12;
  undefined4 *puVar13;
  void *pvVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  byte bVar18;
  int iVar19;
  undefined1 (*pauVar20) [16];
  float *pfVar21;
  ulong uVar22;
  float *pfVar23;
  long lVar24;
  long lVar25;
  long lVar26;
  float *pfVar27;
  undefined1 (*pauVar28) [16];
  int iVar29;
  long lVar30;
  long lVar31;
  uint uVar32;
  long lVar33;
  uint uVar34;
  float *pfVar35;
  long lVar36;
  float *pfVar37;
  int p_1;
  float fVar38;
  float fVar45;
  float fVar46;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  float fVar47;
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  v4sf one;
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  __m128 _a;
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  __m128 min;
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  __m128 max;
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  float fVar126;
  float fVar138;
  float fVar139;
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  float fVar140;
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  float fVar141;
  float fVar145;
  float fVar146;
  float fVar147;
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  float fVar148;
  float fVar149;
  float fVar150;
  float fVar151;
  float fVar152;
  float fVar153;
  float fVar154;
  float fVar155;
  float fVar156;
  float fVar157;
  float fVar158;
  float fVar159;
  Option opt_flatten;
  uint local_138;
  float *local_d0;
  int *local_c8;
  size_t local_c0;
  int local_b8;
  Allocator *local_b0;
  int local_a8;
  int local_a4;
  undefined8 local_a0;
  int local_98;
  size_t local_90;
  ulong local_88;
  long local_80;
  undefined8 local_78;
  Allocator *pAStack_70;
  Allocator *local_68;
  undefined8 uStack_60;
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  
  if ((opt->use_int8_inference == true) && ((this->super_InnerProduct).int8_scale_term != 0)) {
    iVar19 = forward_int8_x86(this,bottom_blob,top_blob,opt);
    return iVar19;
  }
  local_a8 = bottom_blob->dims;
  if (local_a8 == 2) {
    iVar19 = (this->super_InnerProduct).num_output;
    local_a4 = bottom_blob->w;
    if (local_a4 == (this->super_InnerProduct).weight_data_size / iVar19) {
      Mat::create(top_blob,iVar19,bottom_blob->h,bottom_blob->elemsize,bottom_blob->elempack,
                  opt->blob_allocator);
      if (top_blob->data == (void *)0x0) {
        return -100;
      }
      if ((long)top_blob->c * top_blob->cstep == 0) {
        return -100;
      }
      local_80 = (long)bottom_blob->h;
      if (0 < local_80) {
        iVar19 = (this->super_InnerProduct).activation_type;
        pvVar11 = (this->super_InnerProduct).bias_data.data;
        uVar9 = bottom_blob->w;
        uVar34 = top_blob->w;
        bVar18 = (uVar34 & 3) == 0 & opt->use_packing_layout;
        iVar10 = bottom_blob->elempack;
        local_88 = (ulong)(uint)((int)uVar34 >> 2);
        lVar36 = 0;
        do {
          if ((iVar10 == 4 & bVar18) == 0) {
LAB_002aed50:
            if ((iVar10 == 1 & bVar18 & 0 < (int)uVar34 >> 2) != 0) {
              pauVar20 = (undefined1 (*) [16])
                         (top_blob->w * lVar36 * top_blob->elemsize + (long)top_blob->data);
              uVar22 = 0;
              do {
                if (pvVar11 == (void *)0x0) {
                  auVar42 = ZEXT816(0);
                }
                else {
                  auVar42 = *(undefined1 (*) [16])((long)pvVar11 + uVar22 * 0x10);
                }
                if (0 < (int)uVar9) {
                  pfVar27 = (float *)((long)(this->weight_data_tm).w * uVar22 *
                                      (this->weight_data_tm).elemsize +
                                     (long)(this->weight_data_tm).data);
                  lVar26 = 0;
                  auVar130 = auVar42;
                  do {
                    fVar38 = *(float *)((long)bottom_blob->data +
                                       lVar26 * 4 +
                                       bottom_blob->elemsize * lVar36 * (long)bottom_blob->w);
                    auVar42._0_4_ = auVar130._0_4_ + *pfVar27 * fVar38;
                    auVar42._4_4_ = auVar130._4_4_ + pfVar27[1] * fVar38;
                    auVar42._8_4_ = auVar130._8_4_ + pfVar27[2] * fVar38;
                    auVar42._12_4_ = auVar130._12_4_ + pfVar27[3] * fVar38;
                    pfVar27 = pfVar27 + 4;
                    lVar26 = lVar26 + 1;
                    auVar130 = auVar42;
                  } while (uVar9 != (uint)lVar26);
                }
                fVar38 = auVar42._4_4_;
                fVar45 = auVar42._8_4_;
                fVar46 = auVar42._12_4_;
                fVar47 = (float)DAT_005a40b0;
                fVar141 = DAT_005a40b0._4_4_;
                fVar145 = DAT_005a40b0._8_4_;
                fVar146 = DAT_005a40b0._12_4_;
                switch(iVar19) {
                case 1:
                  auVar42 = maxps(auVar42,_DAT_005a4090);
                  break;
                case 2:
                  auVar131 = maxps(auVar42,ZEXT816(0));
                  auVar130 = minps(auVar42,ZEXT816(0));
                  fVar38 = *(this->super_InnerProduct).activation_params.data;
                  auVar42._4_4_ = fVar38 * auVar130._4_4_ + auVar131._4_4_;
                  auVar42._0_4_ = fVar38 * auVar130._0_4_ + auVar131._0_4_;
                  auVar42._8_4_ = fVar38 * auVar130._8_4_ + auVar131._8_4_;
                  auVar42._12_4_ = fVar38 * auVar130._12_4_ + auVar131._12_4_;
                  break;
                case 3:
                  puVar13 = (undefined4 *)(this->super_InnerProduct).activation_params.data;
                  uVar7 = *puVar13;
                  uVar6 = puVar13[1];
                  auVar52._4_4_ = uVar7;
                  auVar52._0_4_ = uVar7;
                  auVar52._8_4_ = uVar7;
                  auVar52._12_4_ = uVar7;
                  auVar71._4_4_ = uVar6;
                  auVar71._0_4_ = uVar6;
                  auVar71._8_4_ = uVar6;
                  auVar71._12_4_ = uVar6;
                  auVar130 = maxps(auVar42,auVar52);
                  auVar42 = minps(auVar130,auVar71);
                  break;
                case 4:
                  auVar41._0_8_ = auVar42._0_8_ ^ 0x8000000080000000;
                  auVar41._8_4_ = -fVar45;
                  auVar41._12_4_ = -fVar46;
                  auVar130 = minps(auVar41,_DAT_005a59e0);
                  auVar130 = maxps(auVar130,_DAT_005a59f0);
                  fVar45 = auVar130._0_4_ * 1.442695 + fVar47;
                  fVar147 = auVar130._4_4_ * 1.442695 + fVar141;
                  fVar138 = auVar130._8_4_ * 1.442695 + fVar145;
                  fVar140 = auVar130._12_4_ * 1.442695 + fVar146;
                  fVar38 = (float)(int)fVar45;
                  fVar46 = (float)(int)fVar147;
                  fVar126 = (float)(int)fVar138;
                  fVar139 = (float)(int)fVar140;
                  fVar148 = (float)DAT_005a5a10;
                  fVar149 = DAT_005a5a10._4_4_;
                  fVar150 = DAT_005a5a10._8_4_;
                  fVar151 = DAT_005a5a10._12_4_;
                  fVar38 = fVar38 - (float)(-(uint)(fVar45 < fVar38) & (uint)fVar148);
                  fVar46 = fVar46 - (float)(-(uint)(fVar147 < fVar46) & (uint)fVar149);
                  fVar126 = fVar126 - (float)(-(uint)(fVar138 < fVar126) & (uint)fVar150);
                  fVar139 = fVar139 - (float)(-(uint)(fVar140 < fVar139) & (uint)fVar151);
                  fVar45 = fVar38 * -0.6931472 + auVar130._0_4_;
                  fVar147 = fVar46 * -0.6931472 + auVar130._4_4_;
                  fVar138 = fVar126 * -0.6931472 + auVar130._8_4_;
                  fVar140 = fVar139 * -0.6931472 + auVar130._12_4_;
                  auVar72._0_4_ =
                       (float)((int)fVar38 * 0x800000 + (int)fVar148) *
                       (fVar45 + fVar148 +
                       (((((fVar45 * 0.00019875691 + 0.0013981999) * fVar45 + 0.008333452) * fVar45
                         + 0.041665796) * fVar45 + 0.16666666) * fVar45 + fVar47) * fVar45 * fVar45)
                       + fVar148;
                  auVar72._4_4_ =
                       (float)((int)fVar46 * 0x800000 + (int)fVar149) *
                       (fVar147 + fVar149 +
                       (((((fVar147 * 0.00019875691 + 0.0013981999) * fVar147 + 0.008333452) *
                          fVar147 + 0.041665796) * fVar147 + 0.16666666) * fVar147 + fVar141) *
                       fVar147 * fVar147) + fVar149;
                  auVar72._8_4_ =
                       (float)((int)fVar126 * 0x800000 + (int)fVar150) *
                       (fVar138 + fVar150 +
                       (((((fVar138 * 0.00019875691 + 0.0013981999) * fVar138 + 0.008333452) *
                          fVar138 + 0.041665796) * fVar138 + 0.16666666) * fVar138 + fVar145) *
                       fVar138 * fVar138) + fVar150;
                  auVar72._12_4_ =
                       (float)((int)fVar139 * 0x800000 + (int)fVar151) *
                       (fVar140 + fVar151 +
                       (((((fVar140 * 0.00019875691 + 0.0013981999) * fVar140 + 0.008333452) *
                          fVar140 + 0.041665796) * fVar140 + 0.16666666) * fVar140 + fVar146) *
                       fVar140 * fVar140) + fVar151;
                  auVar42 = divps(_DAT_005a5a10,auVar72);
                  break;
                case 5:
                  auVar130 = minps(auVar42,_DAT_005a59e0);
                  auVar130 = maxps(auVar130,_DAT_005a59f0);
                  fVar147 = auVar130._0_4_ * 1.442695 + fVar47;
                  fVar126 = auVar130._4_4_ * 1.442695 + fVar141;
                  fVar138 = auVar130._8_4_ * 1.442695 + fVar145;
                  fVar139 = auVar130._12_4_ * 1.442695 + fVar146;
                  fVar140 = (float)(int)fVar147;
                  fVar148 = (float)(int)fVar126;
                  fVar149 = (float)(int)fVar138;
                  fVar150 = (float)(int)fVar139;
                  fVar140 = fVar140 - (float)(-(uint)(fVar147 < fVar140) & 0x3f800000);
                  fVar148 = fVar148 - (float)(-(uint)(fVar126 < fVar148) & 0x3f800000);
                  fVar149 = fVar149 - (float)(-(uint)(fVar138 < fVar149) & 0x3f800000);
                  fVar150 = fVar150 - (float)(-(uint)(fVar139 < fVar150) & 0x3f800000);
                  fVar147 = auVar130._0_4_ - fVar140 * 0.6931472;
                  fVar126 = auVar130._4_4_ - fVar148 * 0.6931472;
                  fVar138 = auVar130._8_4_ - fVar149 * 0.6931472;
                  fVar139 = auVar130._12_4_ - fVar150 * 0.6931472;
                  auVar67._0_4_ =
                       (float)((int)fVar140 * 0x800000 + 0x3f800000) *
                       (fVar147 + 1.0 +
                       (((((fVar147 * 0.00019875691 + 0.0013981999) * fVar147 + 0.008333452) *
                          fVar147 + 0.041665796) * fVar147 + 0.16666666) * fVar147 + fVar47) *
                       fVar147 * fVar147) + 1.0;
                  auVar67._4_4_ =
                       (float)((int)fVar148 * 0x800000 + 0x3f800000) *
                       (fVar126 + 1.0 +
                       (((((fVar126 * 0.00019875691 + 0.0013981999) * fVar126 + 0.008333452) *
                          fVar126 + 0.041665796) * fVar126 + 0.16666666) * fVar126 + fVar141) *
                       fVar126 * fVar126) + 1.0;
                  auVar67._8_4_ =
                       (float)((int)fVar149 * 0x800000 + 0x3f800000) *
                       (fVar138 + 1.0 +
                       (((((fVar138 * 0.00019875691 + 0.0013981999) * fVar138 + 0.008333452) *
                          fVar138 + 0.041665796) * fVar138 + 0.16666666) * fVar138 + fVar145) *
                       fVar138 * fVar138) + 1.0;
                  auVar67._12_4_ =
                       (float)((int)fVar150 * 0x800000 + 0x3f800000) *
                       (fVar139 + 1.0 +
                       (((((fVar139 * 0.00019875691 + 0.0013981999) * fVar139 + 0.008333452) *
                          fVar139 + 0.041665796) * fVar139 + 0.16666666) * fVar139 + fVar146) *
                       fVar139 * fVar139) + 1.0;
                  auVar130 = maxps(auVar67,_DAT_005a5a80);
                  auVar68._0_8_ = auVar130._0_8_ & 0x807fffff807fffff;
                  auVar68._8_4_ = auVar130._8_4_ & 0x807fffff;
                  auVar68._12_4_ = auVar130._12_4_ & 0x807fffff;
                  auVar68 = auVar68 | _DAT_005a40b0;
                  fVar147 = auVar68._0_4_;
                  fVar138 = auVar68._4_4_;
                  fVar140 = auVar68._8_4_;
                  fVar149 = auVar68._12_4_;
                  fVar126 = fVar147 + (float)DAT_005a5ac0 +
                            (float)(-(uint)(fVar147 < 0.70710677) & (uint)fVar147);
                  fVar139 = fVar138 + DAT_005a5ac0._4_4_ +
                            (float)(-(uint)(fVar138 < 0.70710677) & (uint)fVar138);
                  fVar148 = fVar140 + DAT_005a5ac0._8_4_ +
                            (float)(-(uint)(fVar140 < 0.70710677) & (uint)fVar140);
                  fVar150 = fVar149 + DAT_005a5ac0._12_4_ +
                            (float)(-(uint)(fVar149 < 0.70710677) & (uint)fVar149);
                  auVar69._0_4_ =
                       ~-(uint)(auVar67._0_4_ <= 0.0) &
                       (uint)((((float)(int)((auVar130._0_4_ >> 0x17) - 0x7e) -
                               (float)(-(uint)(fVar147 < 0.70710677) & 0x3f800000)) * 0.6931472 +
                               fVar126 +
                              (((((((((fVar126 * 0.070376836 + -0.1151461) * fVar126 + 0.116769984)
                                     * fVar126 + -0.12420141) * fVar126 + 0.14249323) * fVar126 +
                                  -0.16668057) * fVar126 + 0.20000714) * fVar126 + -0.24999994) *
                                fVar126 + 0.3333333) * fVar126 + -0.5) * fVar126 * fVar126) * -2.0);
                  auVar69._4_4_ =
                       ~-(uint)(auVar67._4_4_ <= 0.0) &
                       (uint)((((float)(int)((auVar130._4_4_ >> 0x17) - 0x7e) -
                               (float)(-(uint)(fVar138 < 0.70710677) & 0x3f800000)) * 0.6931472 +
                               fVar139 +
                              (((((((((fVar139 * 0.070376836 + -0.1151461) * fVar139 + 0.116769984)
                                     * fVar139 + -0.12420141) * fVar139 + 0.14249323) * fVar139 +
                                  -0.16668057) * fVar139 + 0.20000714) * fVar139 + -0.24999994) *
                                fVar139 + 0.3333333) * fVar139 + -0.5) * fVar139 * fVar139) * -2.0);
                  auVar69._8_4_ =
                       ~-(uint)(auVar67._8_4_ <= 0.0) &
                       (uint)((((float)(int)((auVar130._8_4_ >> 0x17) - 0x7e) -
                               (float)(-(uint)(fVar140 < 0.70710677) & 0x3f800000)) * 0.6931472 +
                               fVar148 +
                              (((((((((fVar148 * 0.070376836 + -0.1151461) * fVar148 + 0.116769984)
                                     * fVar148 + -0.12420141) * fVar148 + 0.14249323) * fVar148 +
                                  -0.16668057) * fVar148 + 0.20000714) * fVar148 + -0.24999994) *
                                fVar148 + 0.3333333) * fVar148 + -0.5) * fVar148 * fVar148) * -2.0);
                  auVar69._12_4_ =
                       ~-(uint)(auVar67._12_4_ <= 0.0) &
                       (uint)((((float)(int)((auVar130._12_4_ >> 0x17) - 0x7e) -
                               (float)(-(uint)(fVar149 < 0.70710677) & 0x3f800000)) * 0.6931472 +
                               fVar150 +
                              (((((((((fVar150 * 0.070376836 + -0.1151461) * fVar150 + 0.116769984)
                                     * fVar150 + -0.12420141) * fVar150 + 0.14249323) * fVar150 +
                                  -0.16668057) * fVar150 + 0.20000714) * fVar150 + -0.24999994) *
                                fVar150 + 0.3333333) * fVar150 + -0.5) * fVar150 * fVar150) * -2.0);
                  auVar51._0_8_ =
                       CONCAT44(-(uint)(auVar67._4_4_ <= 0.0),-(uint)(auVar67._0_4_ <= 0.0)) &
                       0x7fffffff7fffffff;
                  auVar51._8_4_ = -(uint)(auVar67._8_4_ <= 0.0) & 0x7fffffff;
                  auVar51._12_4_ = -(uint)(auVar67._12_4_ <= 0.0) & 0x7fffffff;
                  auVar130 = minps(auVar51 | auVar69,_DAT_005a59e0);
                  auVar130 = maxps(auVar130,_DAT_005a59f0);
                  fVar147 = auVar130._0_4_ * 1.442695 + fVar47;
                  fVar126 = auVar130._4_4_ * 1.442695 + fVar141;
                  fVar138 = auVar130._8_4_ * 1.442695 + fVar145;
                  fVar139 = auVar130._12_4_ * 1.442695 + fVar146;
                  fVar140 = (float)(int)fVar147;
                  fVar148 = (float)(int)fVar126;
                  fVar149 = (float)(int)fVar138;
                  fVar150 = (float)(int)fVar139;
                  fVar140 = fVar140 - (float)(-(uint)(fVar147 < fVar140) & 0x3f800000);
                  fVar148 = fVar148 - (float)(-(uint)(fVar126 < fVar148) & 0x3f800000);
                  fVar149 = fVar149 - (float)(-(uint)(fVar138 < fVar149) & 0x3f800000);
                  fVar150 = fVar150 - (float)(-(uint)(fVar139 < fVar150) & 0x3f800000);
                  fVar147 = auVar130._0_4_ - fVar140 * 0.6931472;
                  fVar126 = auVar130._4_4_ - fVar148 * 0.6931472;
                  fVar138 = auVar130._8_4_ - fVar149 * 0.6931472;
                  fVar139 = auVar130._12_4_ - fVar150 * 0.6931472;
                  auVar70._0_4_ =
                       (float)((int)fVar140 * 0x800000 + 0x3f800000) *
                       (fVar147 + 1.0 +
                       (((((fVar147 * 0.00019875691 + 0.0013981999) * fVar147 + 0.008333452) *
                          fVar147 + 0.041665796) * fVar147 + 0.16666666) * fVar147 + fVar47) *
                       fVar147 * fVar147) + 1.0;
                  auVar70._4_4_ =
                       (float)((int)fVar148 * 0x800000 + 0x3f800000) *
                       (fVar126 + 1.0 +
                       (((((fVar126 * 0.00019875691 + 0.0013981999) * fVar126 + 0.008333452) *
                          fVar126 + 0.041665796) * fVar126 + 0.16666666) * fVar126 + fVar141) *
                       fVar126 * fVar126) + 1.0;
                  auVar70._8_4_ =
                       (float)((int)fVar149 * 0x800000 + 0x3f800000) *
                       (fVar138 + 1.0 +
                       (((((fVar138 * 0.00019875691 + 0.0013981999) * fVar138 + 0.008333452) *
                          fVar138 + 0.041665796) * fVar138 + 0.16666666) * fVar138 + fVar145) *
                       fVar138 * fVar138) + 1.0;
                  auVar70._12_4_ =
                       (float)((int)fVar150 * 0x800000 + 0x3f800000) *
                       (fVar139 + 1.0 +
                       (((((fVar139 * 0.00019875691 + 0.0013981999) * fVar139 + 0.008333452) *
                          fVar139 + 0.041665796) * fVar139 + 0.16666666) * fVar139 + fVar146) *
                       fVar139 * fVar139) + 1.0;
                  auVar130 = divps(_DAT_005a66a0,auVar70);
                  auVar54._0_4_ = auVar130._0_4_ + (float)DAT_005a5ac0;
                  auVar54._4_4_ = auVar130._4_4_ + DAT_005a5ac0._4_4_;
                  auVar54._8_4_ = auVar130._8_4_ + DAT_005a5ac0._8_4_;
                  auVar54._12_4_ = auVar130._12_4_ + DAT_005a5ac0._12_4_;
                  goto LAB_002af153;
                case 6:
                  pfVar27 = (float *)(this->super_InnerProduct).activation_params.data;
                  fVar47 = *pfVar27;
                  fVar141 = pfVar27[1];
                  auVar53._0_4_ = fVar47 * auVar42._0_4_ + fVar141;
                  auVar53._4_4_ = fVar47 * fVar38 + fVar141;
                  auVar53._8_4_ = fVar47 * fVar45 + fVar141;
                  auVar53._12_4_ = fVar47 * fVar46 + fVar141;
                  auVar130 = maxps(auVar53,_DAT_005a4090);
                  auVar54 = minps(auVar130,_DAT_005a5a10);
LAB_002af153:
                  auVar42._0_4_ = auVar42._0_4_ * auVar54._0_4_;
                  auVar42._4_4_ = fVar38 * auVar54._4_4_;
                  auVar42._8_4_ = fVar45 * auVar54._8_4_;
                  auVar42._12_4_ = fVar46 * auVar54._12_4_;
                }
                *pauVar20 = auVar42;
                pauVar20 = pauVar20 + 1;
                uVar22 = uVar22 + 1;
              } while (uVar22 != local_88);
            }
          }
          else if (0 < (int)local_88) {
            pauVar20 = (undefined1 (*) [16])
                       (top_blob->w * lVar36 * top_blob->elemsize + (long)top_blob->data);
            uVar22 = 0;
            do {
              if (pvVar11 == (void *)0x0) {
                auVar130 = ZEXT816(0);
              }
              else {
                auVar130 = *(undefined1 (*) [16])((long)pvVar11 + uVar22 * 0x10);
              }
              auVar131 = auVar130;
              auVar65 = auVar130;
              auVar103 = auVar130;
              if (0 < (int)uVar9) {
                lVar26 = bottom_blob->elemsize * lVar36 * (long)bottom_blob->w;
                pvVar12 = bottom_blob->data;
                lVar30 = 0;
                auVar133 = auVar130;
                auVar109 = auVar130;
                auVar63 = auVar130;
                auVar92 = auVar130;
                uVar32 = uVar9;
                do {
                  fVar38 = *(float *)((long)pvVar12 + lVar30 + lVar26);
                  fVar45 = *(float *)((long)pvVar12 + lVar30 + lVar26 + 4);
                  fVar46 = *(float *)((long)pvVar12 + lVar30 + lVar26 + 8);
                  fVar47 = *(float *)((long)pvVar12 + lVar30 + lVar26 + 0xc);
                  pfVar27 = (float *)((long)(this->weight_data_tm).data +
                                     lVar30 + (this->weight_data_tm).elemsize * uVar22 *
                                              (long)(this->weight_data_tm).w);
                  fVar141 = *pfVar27;
                  fVar145 = pfVar27[1];
                  fVar146 = pfVar27[2];
                  fVar147 = pfVar27[3];
                  auVar130._0_4_ = auVar133._0_4_ + fVar38 * fVar141;
                  auVar130._4_4_ = auVar133._4_4_ + fVar38 * fVar145;
                  auVar130._8_4_ = auVar133._8_4_ + fVar38 * fVar146;
                  auVar130._12_4_ = auVar133._12_4_ + fVar38 * fVar147;
                  auVar103._0_4_ = auVar92._0_4_ + fVar45 * fVar141;
                  auVar103._4_4_ = auVar92._4_4_ + fVar45 * fVar145;
                  auVar103._8_4_ = auVar92._8_4_ + fVar45 * fVar146;
                  auVar103._12_4_ = auVar92._12_4_ + fVar45 * fVar147;
                  auVar131._0_4_ = auVar109._0_4_ + fVar46 * fVar141;
                  auVar131._4_4_ = auVar109._4_4_ + fVar46 * fVar145;
                  auVar131._8_4_ = auVar109._8_4_ + fVar46 * fVar146;
                  auVar131._12_4_ = auVar109._12_4_ + fVar46 * fVar147;
                  auVar65._0_4_ = auVar63._0_4_ + fVar47 * fVar141;
                  auVar65._4_4_ = auVar63._4_4_ + fVar47 * fVar145;
                  auVar65._8_4_ = auVar63._8_4_ + fVar47 * fVar146;
                  auVar65._12_4_ = auVar63._12_4_ + fVar47 * fVar147;
                  lVar30 = lVar30 + 0x10;
                  uVar32 = uVar32 - 1;
                  auVar133 = auVar130;
                  auVar109 = auVar131;
                  auVar63 = auVar65;
                  auVar92 = auVar103;
                } while (uVar32 != 0);
              }
              fVar38 = auVar130._0_4_;
              fVar45 = auVar130._4_4_;
              fVar46 = auVar130._8_4_;
              fVar47 = auVar130._12_4_;
              fVar140 = auVar103._0_4_;
              fVar148 = auVar103._4_4_;
              fVar149 = auVar103._8_4_;
              fVar150 = auVar103._12_4_;
              fVar141 = auVar131._0_4_;
              fVar145 = auVar131._4_4_;
              fVar146 = auVar131._8_4_;
              fVar147 = auVar131._12_4_;
              fVar126 = auVar65._4_4_;
              fVar138 = auVar65._8_4_;
              fVar139 = auVar65._12_4_;
              switch(iVar19) {
              case 1:
                auVar133 = ZEXT816(0);
                auVar130 = maxps(auVar130,auVar133);
                auVar103 = maxps(auVar103,auVar133);
                auVar131 = maxps(auVar131,auVar133);
                auVar65 = maxps(auVar65,auVar133);
                break;
              case 2:
                auVar63 = ZEXT816(0);
                auVar109 = maxps(auVar130,auVar63);
                auVar133 = minps(auVar130,auVar63);
                fVar38 = *(this->super_InnerProduct).activation_params.data;
                auVar130._0_4_ = auVar133._0_4_ * fVar38 + auVar109._0_4_;
                auVar130._4_4_ = auVar133._4_4_ * fVar38 + auVar109._4_4_;
                auVar130._8_4_ = auVar133._8_4_ * fVar38 + auVar109._8_4_;
                auVar130._12_4_ = auVar133._12_4_ * fVar38 + auVar109._12_4_;
                auVar109 = maxps(auVar103,auVar63);
                auVar133 = minps(auVar103,auVar63);
                auVar103._0_4_ = auVar133._0_4_ * fVar38 + auVar109._0_4_;
                auVar103._4_4_ = auVar133._4_4_ * fVar38 + auVar109._4_4_;
                auVar103._8_4_ = auVar133._8_4_ * fVar38 + auVar109._8_4_;
                auVar103._12_4_ = auVar133._12_4_ * fVar38 + auVar109._12_4_;
                auVar109 = maxps(auVar131,auVar63);
                auVar133 = minps(auVar131,auVar63);
                auVar131._0_4_ = auVar133._0_4_ * fVar38 + auVar109._0_4_;
                auVar131._4_4_ = auVar133._4_4_ * fVar38 + auVar109._4_4_;
                auVar131._8_4_ = auVar133._8_4_ * fVar38 + auVar109._8_4_;
                auVar131._12_4_ = auVar133._12_4_ * fVar38 + auVar109._12_4_;
                auVar109 = maxps(auVar65,auVar63);
                auVar133 = minps(auVar65,auVar63);
                auVar65._0_4_ = auVar133._0_4_ * fVar38 + auVar109._0_4_;
                auVar65._4_4_ = auVar133._4_4_ * fVar38 + auVar109._4_4_;
                auVar65._8_4_ = auVar133._8_4_ * fVar38 + auVar109._8_4_;
                auVar65._12_4_ = auVar133._12_4_ * fVar38 + auVar109._12_4_;
                break;
              case 3:
                puVar13 = (undefined4 *)(this->super_InnerProduct).activation_params.data;
                uVar7 = *puVar13;
                uVar6 = puVar13[1];
                auVar107._4_4_ = uVar7;
                auVar107._0_4_ = uVar7;
                auVar107._8_4_ = uVar7;
                auVar107._12_4_ = uVar7;
                auVar120._4_4_ = uVar6;
                auVar120._0_4_ = uVar6;
                auVar120._8_4_ = uVar6;
                auVar120._12_4_ = uVar6;
                auVar130 = maxps(auVar130,auVar107);
                auVar130 = minps(auVar130,auVar120);
                auVar103 = maxps(auVar103,auVar107);
                auVar103 = minps(auVar103,auVar120);
                auVar131 = maxps(auVar131,auVar107);
                auVar131 = minps(auVar131,auVar120);
                auVar65 = maxps(auVar65,auVar107);
                auVar65 = minps(auVar65,auVar120);
                break;
              case 4:
                auVar39._0_8_ = auVar130._0_8_ ^ 0x8000000080000000;
                auVar39._8_4_ = -fVar46;
                auVar39._12_4_ = -fVar47;
                auVar130 = minps(auVar39,_DAT_005a59e0);
                auVar130 = maxps(auVar130,_DAT_005a59f0);
                fVar38 = auVar130._0_4_ * 1.442695 + 0.5;
                fVar45 = auVar130._4_4_ * 1.442695 + 0.5;
                fVar46 = auVar130._8_4_ * 1.442695 + 0.5;
                fVar47 = auVar130._12_4_ * 1.442695 + 0.5;
                fVar141 = (float)(int)fVar38;
                fVar145 = (float)(int)fVar45;
                fVar126 = (float)(int)fVar46;
                fVar140 = (float)(int)fVar47;
                fVar156 = (float)DAT_005a5a10;
                fVar158 = DAT_005a5a10._4_4_;
                fVar153 = DAT_005a5a10._8_4_;
                fVar155 = DAT_005a5a10._12_4_;
                fVar141 = fVar141 - (float)(-(uint)(fVar38 < fVar141) & (uint)fVar156);
                fVar145 = fVar145 - (float)(-(uint)(fVar45 < fVar145) & (uint)fVar158);
                fVar126 = fVar126 - (float)(-(uint)(fVar46 < fVar126) & (uint)fVar153);
                fVar140 = fVar140 - (float)(-(uint)(fVar47 < fVar140) & (uint)fVar155);
                fVar38 = auVar130._0_4_ - fVar141 * 0.6931472;
                fVar45 = auVar130._4_4_ - fVar145 * 0.6931472;
                fVar46 = auVar130._8_4_ - fVar126 * 0.6931472;
                fVar47 = auVar130._12_4_ - fVar140 * 0.6931472;
                fVar148 = (float)DAT_005a5a60;
                fVar151 = DAT_005a5a60._4_4_;
                fVar152 = DAT_005a5a60._8_4_;
                fVar154 = DAT_005a5a60._12_4_;
                auVar121._0_4_ =
                     (float)((int)fVar141 * 0x800000 + (int)fVar156) *
                     (fVar38 + fVar156 +
                     (((((fVar38 * 0.00019875691 + 0.0013981999) * fVar38 + 0.008333452) * fVar38 +
                       fVar148) * fVar38 + 0.16666666) * fVar38 + 0.5) * fVar38 * fVar38) + fVar156;
                auVar121._4_4_ =
                     (float)((int)fVar145 * 0x800000 + (int)fVar158) *
                     (fVar45 + fVar158 +
                     (((((fVar45 * 0.00019875691 + 0.0013981999) * fVar45 + 0.008333452) * fVar45 +
                       fVar151) * fVar45 + 0.16666666) * fVar45 + 0.5) * fVar45 * fVar45) + fVar158;
                auVar121._8_4_ =
                     (float)((int)fVar126 * 0x800000 + (int)fVar153) *
                     (fVar46 + fVar153 +
                     (((((fVar46 * 0.00019875691 + 0.0013981999) * fVar46 + 0.008333452) * fVar46 +
                       fVar152) * fVar46 + 0.16666666) * fVar46 + 0.5) * fVar46 * fVar46) + fVar153;
                auVar121._12_4_ =
                     (float)((int)fVar140 * 0x800000 + (int)fVar155) *
                     (fVar47 + fVar155 +
                     (((((fVar47 * 0.00019875691 + 0.0013981999) * fVar47 + 0.008333452) * fVar47 +
                       fVar154) * fVar47 + 0.16666666) * fVar47 + 0.5) * fVar47 * fVar47) + fVar155;
                auVar130 = divps(_DAT_005a5a10,auVar121);
                auVar93._0_8_ = auVar103._0_8_ ^ 0x8000000080000000;
                auVar93._8_4_ = -fVar149;
                auVar93._12_4_ = -fVar150;
                auVar103 = minps(auVar93,_DAT_005a59e0);
                auVar103 = maxps(auVar103,_DAT_005a59f0);
                fVar38 = auVar103._0_4_ * 1.442695 + 0.5;
                fVar45 = auVar103._4_4_ * 1.442695 + 0.5;
                fVar46 = auVar103._8_4_ * 1.442695 + 0.5;
                fVar47 = auVar103._12_4_ * 1.442695 + 0.5;
                fVar141 = (float)(int)fVar38;
                fVar145 = (float)(int)fVar45;
                fVar126 = (float)(int)fVar46;
                fVar140 = (float)(int)fVar47;
                fVar141 = fVar141 - (float)(-(uint)(fVar38 < fVar141) & (uint)fVar156);
                fVar145 = fVar145 - (float)(-(uint)(fVar45 < fVar145) & (uint)fVar158);
                fVar126 = fVar126 - (float)(-(uint)(fVar46 < fVar126) & (uint)fVar153);
                fVar140 = fVar140 - (float)(-(uint)(fVar47 < fVar140) & (uint)fVar155);
                fVar38 = auVar103._0_4_ - fVar141 * 0.6931472;
                fVar45 = auVar103._4_4_ - fVar145 * 0.6931472;
                fVar46 = auVar103._8_4_ - fVar126 * 0.6931472;
                fVar47 = auVar103._12_4_ - fVar140 * 0.6931472;
                auVar122._0_4_ =
                     (float)((int)fVar141 * 0x800000 + (int)fVar156) *
                     (fVar38 + fVar156 +
                     (((((fVar38 * 0.00019875691 + 0.0013981999) * fVar38 + 0.008333452) * fVar38 +
                       fVar148) * fVar38 + 0.16666666) * fVar38 + 0.5) * fVar38 * fVar38) + fVar156;
                auVar122._4_4_ =
                     (float)((int)fVar145 * 0x800000 + (int)fVar158) *
                     (fVar45 + fVar158 +
                     (((((fVar45 * 0.00019875691 + 0.0013981999) * fVar45 + 0.008333452) * fVar45 +
                       fVar151) * fVar45 + 0.16666666) * fVar45 + 0.5) * fVar45 * fVar45) + fVar158;
                auVar122._8_4_ =
                     (float)((int)fVar126 * 0x800000 + (int)fVar153) *
                     (fVar46 + fVar153 +
                     (((((fVar46 * 0.00019875691 + 0.0013981999) * fVar46 + 0.008333452) * fVar46 +
                       fVar152) * fVar46 + 0.16666666) * fVar46 + 0.5) * fVar46 * fVar46) + fVar153;
                auVar122._12_4_ =
                     (float)((int)fVar140 * 0x800000 + (int)fVar155) *
                     (fVar47 + fVar155 +
                     (((((fVar47 * 0.00019875691 + 0.0013981999) * fVar47 + 0.008333452) * fVar47 +
                       fVar154) * fVar47 + 0.16666666) * fVar47 + 0.5) * fVar47 * fVar47) + fVar155;
                auVar103 = divps(_DAT_005a5a10,auVar122);
                auVar48._0_8_ = auVar131._0_8_ ^ 0x8000000080000000;
                auVar48._8_4_ = -fVar146;
                auVar48._12_4_ = -fVar147;
                auVar131 = minps(auVar48,_DAT_005a59e0);
                auVar131 = maxps(auVar131,_DAT_005a59f0);
                fVar38 = auVar131._0_4_ * 1.442695 + 0.5;
                fVar45 = auVar131._4_4_ * 1.442695 + 0.5;
                fVar46 = auVar131._8_4_ * 1.442695 + 0.5;
                fVar47 = auVar131._12_4_ * 1.442695 + 0.5;
                fVar141 = (float)(int)fVar38;
                fVar145 = (float)(int)fVar45;
                fVar146 = (float)(int)fVar46;
                fVar147 = (float)(int)fVar47;
                fVar141 = fVar141 - (float)(-(uint)(fVar38 < fVar141) & (uint)fVar156);
                fVar145 = fVar145 - (float)(-(uint)(fVar45 < fVar145) & (uint)fVar158);
                fVar146 = fVar146 - (float)(-(uint)(fVar46 < fVar146) & (uint)fVar153);
                fVar147 = fVar147 - (float)(-(uint)(fVar47 < fVar147) & (uint)fVar155);
                fVar38 = auVar131._0_4_ - fVar141 * 0.6931472;
                fVar45 = auVar131._4_4_ - fVar145 * 0.6931472;
                fVar46 = auVar131._8_4_ - fVar146 * 0.6931472;
                fVar47 = auVar131._12_4_ - fVar147 * 0.6931472;
                auVar123._0_4_ =
                     (float)((int)fVar141 * 0x800000 + (int)fVar156) *
                     (fVar38 + fVar156 +
                     (((((fVar38 * 0.00019875691 + 0.0013981999) * fVar38 + 0.008333452) * fVar38 +
                       fVar148) * fVar38 + 0.16666666) * fVar38 + 0.5) * fVar38 * fVar38) + fVar156;
                auVar123._4_4_ =
                     (float)((int)fVar145 * 0x800000 + (int)fVar158) *
                     (fVar45 + fVar158 +
                     (((((fVar45 * 0.00019875691 + 0.0013981999) * fVar45 + 0.008333452) * fVar45 +
                       fVar151) * fVar45 + 0.16666666) * fVar45 + 0.5) * fVar45 * fVar45) + fVar158;
                auVar123._8_4_ =
                     (float)((int)fVar146 * 0x800000 + (int)fVar153) *
                     (fVar46 + fVar153 +
                     (((((fVar46 * 0.00019875691 + 0.0013981999) * fVar46 + 0.008333452) * fVar46 +
                       fVar152) * fVar46 + 0.16666666) * fVar46 + 0.5) * fVar46 * fVar46) + fVar153;
                auVar123._12_4_ =
                     (float)((int)fVar147 * 0x800000 + (int)fVar155) *
                     (fVar47 + fVar155 +
                     (((((fVar47 * 0.00019875691 + 0.0013981999) * fVar47 + 0.008333452) * fVar47 +
                       fVar154) * fVar47 + 0.16666666) * fVar47 + 0.5) * fVar47 * fVar47) + fVar155;
                auVar131 = divps(_DAT_005a5a10,auVar123);
                auVar64._0_8_ = auVar65._0_8_ ^ 0x8000000080000000;
                auVar64._8_4_ = -fVar138;
                auVar64._12_4_ = -fVar139;
                auVar65 = minps(auVar64,_DAT_005a59e0);
                auVar65 = maxps(auVar65,_DAT_005a59f0);
                fVar38 = auVar65._0_4_ * 1.442695 + 0.5;
                fVar45 = auVar65._4_4_ * 1.442695 + 0.5;
                fVar46 = auVar65._8_4_ * 1.442695 + 0.5;
                fVar47 = auVar65._12_4_ * 1.442695 + 0.5;
                fVar141 = (float)(int)fVar38;
                fVar145 = (float)(int)fVar45;
                fVar146 = (float)(int)fVar46;
                fVar147 = (float)(int)fVar47;
                fVar141 = fVar141 - (float)(-(uint)(fVar38 < fVar141) & (uint)fVar156);
                fVar145 = fVar145 - (float)(-(uint)(fVar45 < fVar145) & (uint)fVar158);
                fVar146 = fVar146 - (float)(-(uint)(fVar46 < fVar146) & (uint)fVar153);
                fVar147 = fVar147 - (float)(-(uint)(fVar47 < fVar147) & (uint)fVar155);
                fVar38 = auVar65._0_4_ - fVar141 * 0.6931472;
                fVar45 = auVar65._4_4_ - fVar145 * 0.6931472;
                fVar46 = auVar65._8_4_ - fVar146 * 0.6931472;
                fVar47 = auVar65._12_4_ - fVar147 * 0.6931472;
                auVar108._0_4_ =
                     (float)((int)fVar141 * 0x800000 + (int)fVar156) *
                     (fVar38 + fVar156 +
                     (((((fVar38 * 0.00019875691 + 0.0013981999) * fVar38 + 0.008333452) * fVar38 +
                       fVar148) * fVar38 + 0.16666666) * fVar38 + 0.5) * fVar38 * fVar38) + fVar156;
                auVar108._4_4_ =
                     (float)((int)fVar145 * 0x800000 + (int)fVar158) *
                     (fVar45 + fVar158 +
                     (((((fVar45 * 0.00019875691 + 0.0013981999) * fVar45 + 0.008333452) * fVar45 +
                       fVar151) * fVar45 + 0.16666666) * fVar45 + 0.5) * fVar45 * fVar45) + fVar158;
                auVar108._8_4_ =
                     (float)((int)fVar146 * 0x800000 + (int)fVar153) *
                     (fVar46 + fVar153 +
                     (((((fVar46 * 0.00019875691 + 0.0013981999) * fVar46 + 0.008333452) * fVar46 +
                       fVar152) * fVar46 + 0.16666666) * fVar46 + 0.5) * fVar46 * fVar46) + fVar153;
                auVar108._12_4_ =
                     (float)((int)fVar147 * 0x800000 + (int)fVar155) *
                     (fVar47 + fVar155 +
                     (((((fVar47 * 0.00019875691 + 0.0013981999) * fVar47 + 0.008333452) * fVar47 +
                       fVar154) * fVar47 + 0.16666666) * fVar47 + 0.5) * fVar47 * fVar47) + fVar155;
                auVar65 = divps(_DAT_005a5a10,auVar108);
                break;
              case 5:
                auVar130 = minps(auVar130,_DAT_005a59e0);
                auVar130 = maxps(auVar130,_DAT_005a59f0);
                fVar151 = auVar130._0_4_ * 1.442695 + 0.5;
                fVar152 = auVar130._4_4_ * 1.442695 + 0.5;
                fVar154 = auVar130._8_4_ * 1.442695 + 0.5;
                fVar156 = auVar130._12_4_ * 1.442695 + 0.5;
                fVar158 = (float)(int)fVar151;
                fVar153 = (float)(int)fVar152;
                fVar155 = (float)(int)fVar154;
                fVar157 = (float)(int)fVar156;
                fVar158 = fVar158 - (float)(-(uint)(fVar151 < fVar158) & 0x3f800000);
                fVar153 = fVar153 - (float)(-(uint)(fVar152 < fVar153) & 0x3f800000);
                fVar155 = fVar155 - (float)(-(uint)(fVar154 < fVar155) & 0x3f800000);
                fVar157 = fVar157 - (float)(-(uint)(fVar156 < fVar157) & 0x3f800000);
                fVar151 = auVar130._0_4_ - fVar158 * 0.6931472;
                fVar152 = auVar130._4_4_ - fVar153 * 0.6931472;
                fVar154 = auVar130._8_4_ - fVar155 * 0.6931472;
                fVar156 = auVar130._12_4_ - fVar157 * 0.6931472;
                auVar111._0_4_ =
                     (float)((int)fVar158 * 0x800000 + 0x3f800000) *
                     (fVar151 + 1.0 +
                     (((((fVar151 * 0.00019875691 + 0.0013981999) * fVar151 + 0.008333452) * fVar151
                       + 0.041665796) * fVar151 + 0.16666666) * fVar151 + 0.5) * fVar151 * fVar151)
                     + 1.0;
                auVar111._4_4_ =
                     (float)((int)fVar153 * 0x800000 + 0x3f800000) *
                     (fVar152 + 1.0 +
                     (((((fVar152 * 0.00019875691 + 0.0013981999) * fVar152 + 0.008333452) * fVar152
                       + 0.041665796) * fVar152 + 0.16666666) * fVar152 + 0.5) * fVar152 * fVar152)
                     + 1.0;
                auVar111._8_4_ =
                     (float)((int)fVar155 * 0x800000 + 0x3f800000) *
                     (fVar154 + 1.0 +
                     (((((fVar154 * 0.00019875691 + 0.0013981999) * fVar154 + 0.008333452) * fVar154
                       + 0.041665796) * fVar154 + 0.16666666) * fVar154 + 0.5) * fVar154 * fVar154)
                     + 1.0;
                auVar111._12_4_ =
                     (float)((int)fVar157 * 0x800000 + 0x3f800000) *
                     (fVar156 + 1.0 +
                     (((((fVar156 * 0.00019875691 + 0.0013981999) * fVar156 + 0.008333452) * fVar156
                       + 0.041665796) * fVar156 + 0.16666666) * fVar156 + 0.5) * fVar156 * fVar156)
                     + 1.0;
                auVar130 = maxps(auVar111,_DAT_005a5a80);
                fVar151 = (float)(auVar130._0_4_ & 0x807fffff | 0x3f000000);
                fVar154 = (float)(auVar130._4_4_ & 0x807fffff | 0x3f000000);
                fVar158 = (float)(auVar130._8_4_ & 0x807fffff | 0x3f000000);
                fVar155 = (float)(auVar130._12_4_ & 0x807fffff | 0x3f000000);
                fVar152 = fVar151 + -1.0 + (float)(-(uint)(fVar151 < 0.70710677) & (uint)fVar151);
                fVar156 = fVar154 + -1.0 + (float)(-(uint)(fVar154 < 0.70710677) & (uint)fVar154);
                fVar153 = fVar158 + -1.0 + (float)(-(uint)(fVar158 < 0.70710677) & (uint)fVar158);
                fVar157 = fVar155 + -1.0 + (float)(-(uint)(fVar155 < 0.70710677) & (uint)fVar155);
                auVar112._0_8_ =
                     CONCAT44(-(uint)(auVar111._4_4_ <= 0.0),-(uint)(auVar111._0_4_ <= 0.0)) &
                     0x7fffffff7fffffff;
                auVar112._8_4_ = -(uint)(auVar111._8_4_ <= 0.0) & 0x7fffffff;
                auVar112._12_4_ = -(uint)(auVar111._12_4_ <= 0.0) & 0x7fffffff;
                auVar102._0_4_ =
                     ~-(uint)(auVar111._0_4_ <= 0.0) &
                     (uint)((((float)(int)((auVar130._0_4_ >> 0x17) - 0x7e) -
                             (float)(-(uint)(fVar151 < 0.70710677) & 0x3f800000)) * 0.6931472 +
                             fVar152 +
                            (((((((((fVar152 * 0.070376836 + -0.1151461) * fVar152 + 0.116769984) *
                                   fVar152 + -0.12420141) * fVar152 + 0.14249323) * fVar152 +
                                -0.16668057) * fVar152 + 0.20000714) * fVar152 + -0.24999994) *
                              fVar152 + 0.3333333) * fVar152 + -0.5) * fVar152 * fVar152) * -2.0);
                auVar102._4_4_ =
                     ~-(uint)(auVar111._4_4_ <= 0.0) &
                     (uint)((((float)(int)((auVar130._4_4_ >> 0x17) - 0x7e) -
                             (float)(-(uint)(fVar154 < 0.70710677) & 0x3f800000)) * 0.6931472 +
                             fVar156 +
                            (((((((((fVar156 * 0.070376836 + -0.1151461) * fVar156 + 0.116769984) *
                                   fVar156 + -0.12420141) * fVar156 + 0.14249323) * fVar156 +
                                -0.16668057) * fVar156 + 0.20000714) * fVar156 + -0.24999994) *
                              fVar156 + 0.3333333) * fVar156 + -0.5) * fVar156 * fVar156) * -2.0);
                auVar102._8_4_ =
                     ~-(uint)(auVar111._8_4_ <= 0.0) &
                     (uint)((((float)(int)((auVar130._8_4_ >> 0x17) - 0x7e) -
                             (float)(-(uint)(fVar158 < 0.70710677) & 0x3f800000)) * 0.6931472 +
                             fVar153 +
                            (((((((((fVar153 * 0.070376836 + -0.1151461) * fVar153 + 0.116769984) *
                                   fVar153 + -0.12420141) * fVar153 + 0.14249323) * fVar153 +
                                -0.16668057) * fVar153 + 0.20000714) * fVar153 + -0.24999994) *
                              fVar153 + 0.3333333) * fVar153 + -0.5) * fVar153 * fVar153) * -2.0);
                auVar102._12_4_ =
                     ~-(uint)(auVar111._12_4_ <= 0.0) &
                     (uint)((((float)(int)((auVar130._12_4_ >> 0x17) - 0x7e) -
                             (float)(-(uint)(fVar155 < 0.70710677) & 0x3f800000)) * 0.6931472 +
                             fVar157 +
                            (((((((((fVar157 * 0.070376836 + -0.1151461) * fVar157 + 0.116769984) *
                                   fVar157 + -0.12420141) * fVar157 + 0.14249323) * fVar157 +
                                -0.16668057) * fVar157 + 0.20000714) * fVar157 + -0.24999994) *
                              fVar157 + 0.3333333) * fVar157 + -0.5) * fVar157 * fVar157) * -2.0);
                auVar130 = minps(auVar102 | auVar112,_DAT_005a59e0);
                auVar130 = maxps(auVar130,_DAT_005a59f0);
                fVar151 = auVar130._0_4_ * 1.442695 + 0.5;
                fVar152 = auVar130._4_4_ * 1.442695 + 0.5;
                fVar154 = auVar130._8_4_ * 1.442695 + 0.5;
                fVar156 = auVar130._12_4_ * 1.442695 + 0.5;
                fVar158 = (float)(int)fVar151;
                fVar153 = (float)(int)fVar152;
                fVar155 = (float)(int)fVar154;
                fVar157 = (float)(int)fVar156;
                fVar158 = fVar158 - (float)(-(uint)(fVar151 < fVar158) & 0x3f800000);
                fVar153 = fVar153 - (float)(-(uint)(fVar152 < fVar153) & 0x3f800000);
                fVar155 = fVar155 - (float)(-(uint)(fVar154 < fVar155) & 0x3f800000);
                fVar157 = fVar157 - (float)(-(uint)(fVar156 < fVar157) & 0x3f800000);
                fVar151 = auVar130._0_4_ - fVar158 * 0.6931472;
                fVar152 = auVar130._4_4_ - fVar153 * 0.6931472;
                fVar154 = auVar130._8_4_ - fVar155 * 0.6931472;
                fVar156 = auVar130._12_4_ - fVar157 * 0.6931472;
                auVar127._0_4_ =
                     (float)((int)fVar158 * 0x800000 + 0x3f800000) *
                     (fVar151 + 1.0 +
                     (((((fVar151 * 0.00019875691 + 0.0013981999) * fVar151 + 0.008333452) * fVar151
                       + 0.041665796) * fVar151 + 0.16666666) * fVar151 + 0.5) * fVar151 * fVar151)
                     + 1.0;
                auVar127._4_4_ =
                     (float)((int)fVar153 * 0x800000 + 0x3f800000) *
                     (fVar152 + 1.0 +
                     (((((fVar152 * 0.00019875691 + 0.0013981999) * fVar152 + 0.008333452) * fVar152
                       + 0.041665796) * fVar152 + 0.16666666) * fVar152 + 0.5) * fVar152 * fVar152)
                     + 1.0;
                auVar127._8_4_ =
                     (float)((int)fVar155 * 0x800000 + 0x3f800000) *
                     (fVar154 + 1.0 +
                     (((((fVar154 * 0.00019875691 + 0.0013981999) * fVar154 + 0.008333452) * fVar154
                       + 0.041665796) * fVar154 + 0.16666666) * fVar154 + 0.5) * fVar154 * fVar154)
                     + 1.0;
                auVar127._12_4_ =
                     (float)((int)fVar157 * 0x800000 + 0x3f800000) *
                     (fVar156 + 1.0 +
                     (((((fVar156 * 0.00019875691 + 0.0013981999) * fVar156 + 0.008333452) * fVar156
                       + 0.041665796) * fVar156 + 0.16666666) * fVar156 + 0.5) * fVar156 * fVar156)
                     + 1.0;
                auVar133 = divps(_DAT_005a66a0,auVar127);
                auVar130._0_4_ = fVar38 * (auVar133._0_4_ + -1.0);
                auVar130._4_4_ = fVar45 * (auVar133._4_4_ + -1.0);
                auVar130._8_4_ = fVar46 * (auVar133._8_4_ + -1.0);
                auVar130._12_4_ = fVar47 * (auVar133._12_4_ + -1.0);
                auVar103 = minps(auVar103,_DAT_005a59e0);
                auVar103 = maxps(auVar103,_DAT_005a59f0);
                fVar38 = auVar103._0_4_ * 1.442695 + 0.5;
                fVar45 = auVar103._4_4_ * 1.442695 + 0.5;
                fVar46 = auVar103._8_4_ * 1.442695 + 0.5;
                fVar47 = auVar103._12_4_ * 1.442695 + 0.5;
                fVar151 = (float)(int)fVar38;
                fVar152 = (float)(int)fVar45;
                fVar154 = (float)(int)fVar46;
                fVar156 = (float)(int)fVar47;
                fVar151 = fVar151 - (float)(-(uint)(fVar38 < fVar151) & 0x3f800000);
                fVar152 = fVar152 - (float)(-(uint)(fVar45 < fVar152) & 0x3f800000);
                fVar154 = fVar154 - (float)(-(uint)(fVar46 < fVar154) & 0x3f800000);
                fVar156 = fVar156 - (float)(-(uint)(fVar47 < fVar156) & 0x3f800000);
                fVar38 = auVar103._0_4_ - fVar151 * 0.6931472;
                fVar45 = auVar103._4_4_ - fVar152 * 0.6931472;
                fVar46 = auVar103._8_4_ - fVar154 * 0.6931472;
                fVar47 = auVar103._12_4_ - fVar156 * 0.6931472;
                auVar113._0_4_ =
                     (float)((int)fVar151 * 0x800000 + 0x3f800000) *
                     (fVar38 + 1.0 +
                     (((((fVar38 * 0.00019875691 + 0.0013981999) * fVar38 + 0.008333452) * fVar38 +
                       0.041665796) * fVar38 + 0.16666666) * fVar38 + 0.5) * fVar38 * fVar38) + 1.0;
                auVar113._4_4_ =
                     (float)((int)fVar152 * 0x800000 + 0x3f800000) *
                     (fVar45 + 1.0 +
                     (((((fVar45 * 0.00019875691 + 0.0013981999) * fVar45 + 0.008333452) * fVar45 +
                       0.041665796) * fVar45 + 0.16666666) * fVar45 + 0.5) * fVar45 * fVar45) + 1.0;
                auVar113._8_4_ =
                     (float)((int)fVar154 * 0x800000 + 0x3f800000) *
                     (fVar46 + 1.0 +
                     (((((fVar46 * 0.00019875691 + 0.0013981999) * fVar46 + 0.008333452) * fVar46 +
                       0.041665796) * fVar46 + 0.16666666) * fVar46 + 0.5) * fVar46 * fVar46) + 1.0;
                auVar113._12_4_ =
                     (float)((int)fVar156 * 0x800000 + 0x3f800000) *
                     (fVar47 + 1.0 +
                     (((((fVar47 * 0.00019875691 + 0.0013981999) * fVar47 + 0.008333452) * fVar47 +
                       0.041665796) * fVar47 + 0.16666666) * fVar47 + 0.5) * fVar47 * fVar47) + 1.0;
                auVar103 = maxps(auVar113,_DAT_005a5a80);
                fVar38 = (float)(auVar103._0_4_ & 0x807fffff | 0x3f000000);
                fVar46 = (float)(auVar103._4_4_ & 0x807fffff | 0x3f000000);
                fVar151 = (float)(auVar103._8_4_ & 0x807fffff | 0x3f000000);
                fVar154 = (float)(auVar103._12_4_ & 0x807fffff | 0x3f000000);
                fVar45 = fVar38 + -1.0 + (float)(-(uint)(fVar38 < 0.70710677) & (uint)fVar38);
                fVar47 = fVar46 + -1.0 + (float)(-(uint)(fVar46 < 0.70710677) & (uint)fVar46);
                fVar152 = fVar151 + -1.0 + (float)(-(uint)(fVar151 < 0.70710677) & (uint)fVar151);
                fVar156 = fVar154 + -1.0 + (float)(-(uint)(fVar154 < 0.70710677) & (uint)fVar154);
                auVar114._0_8_ =
                     CONCAT44(-(uint)(auVar113._4_4_ <= 0.0),-(uint)(auVar113._0_4_ <= 0.0)) &
                     0x7fffffff7fffffff;
                auVar114._8_4_ = -(uint)(auVar113._8_4_ <= 0.0) & 0x7fffffff;
                auVar114._12_4_ = -(uint)(auVar113._12_4_ <= 0.0) & 0x7fffffff;
                auVar104._0_4_ =
                     ~-(uint)(auVar113._0_4_ <= 0.0) &
                     (uint)((((float)(int)((auVar103._0_4_ >> 0x17) - 0x7e) -
                             (float)(-(uint)(fVar38 < 0.70710677) & 0x3f800000)) * 0.6931472 +
                             fVar45 + (((((((((fVar45 * 0.070376836 + -0.1151461) * fVar45 +
                                             0.116769984) * fVar45 + -0.12420141) * fVar45 +
                                           0.14249323) * fVar45 + -0.16668057) * fVar45 + 0.20000714
                                         ) * fVar45 + -0.24999994) * fVar45 + 0.3333333) * fVar45 +
                                      -0.5) * fVar45 * fVar45) * -2.0);
                auVar104._4_4_ =
                     ~-(uint)(auVar113._4_4_ <= 0.0) &
                     (uint)((((float)(int)((auVar103._4_4_ >> 0x17) - 0x7e) -
                             (float)(-(uint)(fVar46 < 0.70710677) & 0x3f800000)) * 0.6931472 +
                             fVar47 + (((((((((fVar47 * 0.070376836 + -0.1151461) * fVar47 +
                                             0.116769984) * fVar47 + -0.12420141) * fVar47 +
                                           0.14249323) * fVar47 + -0.16668057) * fVar47 + 0.20000714
                                         ) * fVar47 + -0.24999994) * fVar47 + 0.3333333) * fVar47 +
                                      -0.5) * fVar47 * fVar47) * -2.0);
                auVar104._8_4_ =
                     ~-(uint)(auVar113._8_4_ <= 0.0) &
                     (uint)((((float)(int)((auVar103._8_4_ >> 0x17) - 0x7e) -
                             (float)(-(uint)(fVar151 < 0.70710677) & 0x3f800000)) * 0.6931472 +
                             fVar152 +
                            (((((((((fVar152 * 0.070376836 + -0.1151461) * fVar152 + 0.116769984) *
                                   fVar152 + -0.12420141) * fVar152 + 0.14249323) * fVar152 +
                                -0.16668057) * fVar152 + 0.20000714) * fVar152 + -0.24999994) *
                              fVar152 + 0.3333333) * fVar152 + -0.5) * fVar152 * fVar152) * -2.0);
                auVar104._12_4_ =
                     ~-(uint)(auVar113._12_4_ <= 0.0) &
                     (uint)((((float)(int)((auVar103._12_4_ >> 0x17) - 0x7e) -
                             (float)(-(uint)(fVar154 < 0.70710677) & 0x3f800000)) * 0.6931472 +
                             fVar156 +
                            (((((((((fVar156 * 0.070376836 + -0.1151461) * fVar156 + 0.116769984) *
                                   fVar156 + -0.12420141) * fVar156 + 0.14249323) * fVar156 +
                                -0.16668057) * fVar156 + 0.20000714) * fVar156 + -0.24999994) *
                              fVar156 + 0.3333333) * fVar156 + -0.5) * fVar156 * fVar156) * -2.0);
                auVar103 = minps(auVar104 | auVar114,_DAT_005a59e0);
                auVar103 = maxps(auVar103,_DAT_005a59f0);
                fVar38 = auVar103._0_4_ * 1.442695 + 0.5;
                fVar45 = auVar103._4_4_ * 1.442695 + 0.5;
                fVar46 = auVar103._8_4_ * 1.442695 + 0.5;
                fVar47 = auVar103._12_4_ * 1.442695 + 0.5;
                fVar151 = (float)(int)fVar38;
                fVar152 = (float)(int)fVar45;
                fVar154 = (float)(int)fVar46;
                fVar156 = (float)(int)fVar47;
                fVar151 = fVar151 - (float)(-(uint)(fVar38 < fVar151) & 0x3f800000);
                fVar152 = fVar152 - (float)(-(uint)(fVar45 < fVar152) & 0x3f800000);
                fVar154 = fVar154 - (float)(-(uint)(fVar46 < fVar154) & 0x3f800000);
                fVar156 = fVar156 - (float)(-(uint)(fVar47 < fVar156) & 0x3f800000);
                fVar38 = auVar103._0_4_ - fVar151 * 0.6931472;
                fVar45 = auVar103._4_4_ - fVar152 * 0.6931472;
                fVar46 = auVar103._8_4_ - fVar154 * 0.6931472;
                fVar47 = auVar103._12_4_ - fVar156 * 0.6931472;
                auVar128._0_4_ =
                     (float)((int)fVar151 * 0x800000 + 0x3f800000) *
                     (fVar38 + 1.0 +
                     (((((fVar38 * 0.00019875691 + 0.0013981999) * fVar38 + 0.008333452) * fVar38 +
                       0.041665796) * fVar38 + 0.16666666) * fVar38 + 0.5) * fVar38 * fVar38) + 1.0;
                auVar128._4_4_ =
                     (float)((int)fVar152 * 0x800000 + 0x3f800000) *
                     (fVar45 + 1.0 +
                     (((((fVar45 * 0.00019875691 + 0.0013981999) * fVar45 + 0.008333452) * fVar45 +
                       0.041665796) * fVar45 + 0.16666666) * fVar45 + 0.5) * fVar45 * fVar45) + 1.0;
                auVar128._8_4_ =
                     (float)((int)fVar154 * 0x800000 + 0x3f800000) *
                     (fVar46 + 1.0 +
                     (((((fVar46 * 0.00019875691 + 0.0013981999) * fVar46 + 0.008333452) * fVar46 +
                       0.041665796) * fVar46 + 0.16666666) * fVar46 + 0.5) * fVar46 * fVar46) + 1.0;
                auVar128._12_4_ =
                     (float)((int)fVar156 * 0x800000 + 0x3f800000) *
                     (fVar47 + 1.0 +
                     (((((fVar47 * 0.00019875691 + 0.0013981999) * fVar47 + 0.008333452) * fVar47 +
                       0.041665796) * fVar47 + 0.16666666) * fVar47 + 0.5) * fVar47 * fVar47) + 1.0;
                auVar133 = divps(_DAT_005a66a0,auVar128);
                auVar103._0_4_ = fVar140 * (auVar133._0_4_ + -1.0);
                auVar103._4_4_ = fVar148 * (auVar133._4_4_ + -1.0);
                auVar103._8_4_ = fVar149 * (auVar133._8_4_ + -1.0);
                auVar103._12_4_ = fVar150 * (auVar133._12_4_ + -1.0);
                auVar131 = minps(auVar131,_DAT_005a59e0);
                auVar131 = maxps(auVar131,_DAT_005a59f0);
                fVar38 = auVar131._0_4_ * 1.442695 + 0.5;
                fVar45 = auVar131._4_4_ * 1.442695 + 0.5;
                fVar46 = auVar131._8_4_ * 1.442695 + 0.5;
                fVar47 = auVar131._12_4_ * 1.442695 + 0.5;
                fVar140 = (float)(int)fVar38;
                fVar148 = (float)(int)fVar45;
                fVar149 = (float)(int)fVar46;
                fVar150 = (float)(int)fVar47;
                fVar140 = fVar140 - (float)(-(uint)(fVar38 < fVar140) & 0x3f800000);
                fVar148 = fVar148 - (float)(-(uint)(fVar45 < fVar148) & 0x3f800000);
                fVar149 = fVar149 - (float)(-(uint)(fVar46 < fVar149) & 0x3f800000);
                fVar150 = fVar150 - (float)(-(uint)(fVar47 < fVar150) & 0x3f800000);
                fVar38 = auVar131._0_4_ - fVar140 * 0.6931472;
                fVar45 = auVar131._4_4_ - fVar148 * 0.6931472;
                fVar46 = auVar131._8_4_ - fVar149 * 0.6931472;
                fVar47 = auVar131._12_4_ - fVar150 * 0.6931472;
                auVar115._0_4_ =
                     (float)((int)fVar140 * 0x800000 + 0x3f800000) *
                     (fVar38 + 1.0 +
                     (((((fVar38 * 0.00019875691 + 0.0013981999) * fVar38 + 0.008333452) * fVar38 +
                       0.041665796) * fVar38 + 0.16666666) * fVar38 + 0.5) * fVar38 * fVar38) + 1.0;
                auVar115._4_4_ =
                     (float)((int)fVar148 * 0x800000 + 0x3f800000) *
                     (fVar45 + 1.0 +
                     (((((fVar45 * 0.00019875691 + 0.0013981999) * fVar45 + 0.008333452) * fVar45 +
                       0.041665796) * fVar45 + 0.16666666) * fVar45 + 0.5) * fVar45 * fVar45) + 1.0;
                auVar115._8_4_ =
                     (float)((int)fVar149 * 0x800000 + 0x3f800000) *
                     (fVar46 + 1.0 +
                     (((((fVar46 * 0.00019875691 + 0.0013981999) * fVar46 + 0.008333452) * fVar46 +
                       0.041665796) * fVar46 + 0.16666666) * fVar46 + 0.5) * fVar46 * fVar46) + 1.0;
                auVar115._12_4_ =
                     (float)((int)fVar150 * 0x800000 + 0x3f800000) *
                     (fVar47 + 1.0 +
                     (((((fVar47 * 0.00019875691 + 0.0013981999) * fVar47 + 0.008333452) * fVar47 +
                       0.041665796) * fVar47 + 0.16666666) * fVar47 + 0.5) * fVar47 * fVar47) + 1.0;
                auVar131 = maxps(auVar115,_DAT_005a5a80);
                fVar38 = (float)(auVar131._0_4_ & 0x807fffff | 0x3f000000);
                fVar46 = (float)(auVar131._4_4_ & 0x807fffff | 0x3f000000);
                fVar140 = (float)(auVar131._8_4_ & 0x807fffff | 0x3f000000);
                fVar149 = (float)(auVar131._12_4_ & 0x807fffff | 0x3f000000);
                fVar45 = fVar38 + -1.0 + (float)(-(uint)(fVar38 < 0.70710677) & (uint)fVar38);
                fVar47 = fVar46 + -1.0 + (float)(-(uint)(fVar46 < 0.70710677) & (uint)fVar46);
                fVar148 = fVar140 + -1.0 + (float)(-(uint)(fVar140 < 0.70710677) & (uint)fVar140);
                fVar150 = fVar149 + -1.0 + (float)(-(uint)(fVar149 < 0.70710677) & (uint)fVar149);
                auVar116._0_8_ =
                     CONCAT44(-(uint)(auVar115._4_4_ <= 0.0),-(uint)(auVar115._0_4_ <= 0.0)) &
                     0x7fffffff7fffffff;
                auVar116._8_4_ = -(uint)(auVar115._8_4_ <= 0.0) & 0x7fffffff;
                auVar116._12_4_ = -(uint)(auVar115._12_4_ <= 0.0) & 0x7fffffff;
                auVar105._0_4_ =
                     ~-(uint)(auVar115._0_4_ <= 0.0) &
                     (uint)((((float)(int)((auVar131._0_4_ >> 0x17) - 0x7e) -
                             (float)(-(uint)(fVar38 < 0.70710677) & 0x3f800000)) * 0.6931472 +
                             fVar45 + (((((((((fVar45 * 0.070376836 + -0.1151461) * fVar45 +
                                             0.116769984) * fVar45 + -0.12420141) * fVar45 +
                                           0.14249323) * fVar45 + -0.16668057) * fVar45 + 0.20000714
                                         ) * fVar45 + -0.24999994) * fVar45 + 0.3333333) * fVar45 +
                                      -0.5) * fVar45 * fVar45) * -2.0);
                auVar105._4_4_ =
                     ~-(uint)(auVar115._4_4_ <= 0.0) &
                     (uint)((((float)(int)((auVar131._4_4_ >> 0x17) - 0x7e) -
                             (float)(-(uint)(fVar46 < 0.70710677) & 0x3f800000)) * 0.6931472 +
                             fVar47 + (((((((((fVar47 * 0.070376836 + -0.1151461) * fVar47 +
                                             0.116769984) * fVar47 + -0.12420141) * fVar47 +
                                           0.14249323) * fVar47 + -0.16668057) * fVar47 + 0.20000714
                                         ) * fVar47 + -0.24999994) * fVar47 + 0.3333333) * fVar47 +
                                      -0.5) * fVar47 * fVar47) * -2.0);
                auVar105._8_4_ =
                     ~-(uint)(auVar115._8_4_ <= 0.0) &
                     (uint)((((float)(int)((auVar131._8_4_ >> 0x17) - 0x7e) -
                             (float)(-(uint)(fVar140 < 0.70710677) & 0x3f800000)) * 0.6931472 +
                             fVar148 +
                            (((((((((fVar148 * 0.070376836 + -0.1151461) * fVar148 + 0.116769984) *
                                   fVar148 + -0.12420141) * fVar148 + 0.14249323) * fVar148 +
                                -0.16668057) * fVar148 + 0.20000714) * fVar148 + -0.24999994) *
                              fVar148 + 0.3333333) * fVar148 + -0.5) * fVar148 * fVar148) * -2.0);
                auVar105._12_4_ =
                     ~-(uint)(auVar115._12_4_ <= 0.0) &
                     (uint)((((float)(int)((auVar131._12_4_ >> 0x17) - 0x7e) -
                             (float)(-(uint)(fVar149 < 0.70710677) & 0x3f800000)) * 0.6931472 +
                             fVar150 +
                            (((((((((fVar150 * 0.070376836 + -0.1151461) * fVar150 + 0.116769984) *
                                   fVar150 + -0.12420141) * fVar150 + 0.14249323) * fVar150 +
                                -0.16668057) * fVar150 + 0.20000714) * fVar150 + -0.24999994) *
                              fVar150 + 0.3333333) * fVar150 + -0.5) * fVar150 * fVar150) * -2.0);
                auVar131 = minps(auVar105 | auVar116,_DAT_005a59e0);
                auVar131 = maxps(auVar131,_DAT_005a59f0);
                fVar38 = auVar131._0_4_ * 1.442695 + 0.5;
                fVar45 = auVar131._4_4_ * 1.442695 + 0.5;
                fVar46 = auVar131._8_4_ * 1.442695 + 0.5;
                fVar47 = auVar131._12_4_ * 1.442695 + 0.5;
                fVar140 = (float)(int)fVar38;
                fVar148 = (float)(int)fVar45;
                fVar149 = (float)(int)fVar46;
                fVar150 = (float)(int)fVar47;
                fVar140 = fVar140 - (float)(-(uint)(fVar38 < fVar140) & 0x3f800000);
                fVar148 = fVar148 - (float)(-(uint)(fVar45 < fVar148) & 0x3f800000);
                fVar149 = fVar149 - (float)(-(uint)(fVar46 < fVar149) & 0x3f800000);
                fVar150 = fVar150 - (float)(-(uint)(fVar47 < fVar150) & 0x3f800000);
                fVar38 = auVar131._0_4_ - fVar140 * 0.6931472;
                fVar45 = auVar131._4_4_ - fVar148 * 0.6931472;
                fVar46 = auVar131._8_4_ - fVar149 * 0.6931472;
                fVar47 = auVar131._12_4_ - fVar150 * 0.6931472;
                auVar129._0_4_ =
                     (float)((int)fVar140 * 0x800000 + 0x3f800000) *
                     (fVar38 + 1.0 +
                     (((((fVar38 * 0.00019875691 + 0.0013981999) * fVar38 + 0.008333452) * fVar38 +
                       0.041665796) * fVar38 + 0.16666666) * fVar38 + 0.5) * fVar38 * fVar38) + 1.0;
                auVar129._4_4_ =
                     (float)((int)fVar148 * 0x800000 + 0x3f800000) *
                     (fVar45 + 1.0 +
                     (((((fVar45 * 0.00019875691 + 0.0013981999) * fVar45 + 0.008333452) * fVar45 +
                       0.041665796) * fVar45 + 0.16666666) * fVar45 + 0.5) * fVar45 * fVar45) + 1.0;
                auVar129._8_4_ =
                     (float)((int)fVar149 * 0x800000 + 0x3f800000) *
                     (fVar46 + 1.0 +
                     (((((fVar46 * 0.00019875691 + 0.0013981999) * fVar46 + 0.008333452) * fVar46 +
                       0.041665796) * fVar46 + 0.16666666) * fVar46 + 0.5) * fVar46 * fVar46) + 1.0;
                auVar129._12_4_ =
                     (float)((int)fVar150 * 0x800000 + 0x3f800000) *
                     (fVar47 + 1.0 +
                     (((((fVar47 * 0.00019875691 + 0.0013981999) * fVar47 + 0.008333452) * fVar47 +
                       0.041665796) * fVar47 + 0.16666666) * fVar47 + 0.5) * fVar47 * fVar47) + 1.0;
                auVar133 = divps(_DAT_005a66a0,auVar129);
                auVar131._0_4_ = fVar141 * (auVar133._0_4_ + -1.0);
                auVar131._4_4_ = fVar145 * (auVar133._4_4_ + -1.0);
                auVar131._8_4_ = fVar146 * (auVar133._8_4_ + -1.0);
                auVar131._12_4_ = fVar147 * (auVar133._12_4_ + -1.0);
                auVar133 = minps(auVar65,_DAT_005a59e0);
                auVar133 = maxps(auVar133,_DAT_005a59f0);
                fVar38 = auVar133._0_4_ * 1.442695 + 0.5;
                fVar45 = auVar133._4_4_ * 1.442695 + 0.5;
                fVar46 = auVar133._8_4_ * 1.442695 + 0.5;
                fVar47 = auVar133._12_4_ * 1.442695 + 0.5;
                fVar141 = (float)(int)fVar38;
                fVar145 = (float)(int)fVar45;
                fVar146 = (float)(int)fVar46;
                fVar147 = (float)(int)fVar47;
                fVar141 = fVar141 - (float)(-(uint)(fVar38 < fVar141) & 0x3f800000);
                fVar145 = fVar145 - (float)(-(uint)(fVar45 < fVar145) & 0x3f800000);
                fVar146 = fVar146 - (float)(-(uint)(fVar46 < fVar146) & 0x3f800000);
                fVar147 = fVar147 - (float)(-(uint)(fVar47 < fVar147) & 0x3f800000);
                fVar38 = auVar133._0_4_ - fVar141 * 0.6931472;
                fVar45 = auVar133._4_4_ - fVar145 * 0.6931472;
                fVar46 = auVar133._8_4_ - fVar146 * 0.6931472;
                fVar47 = auVar133._12_4_ - fVar147 * 0.6931472;
                auVar117._0_4_ =
                     (float)((int)fVar141 * 0x800000 + 0x3f800000) *
                     (fVar38 + 1.0 +
                     (((((fVar38 * 0.00019875691 + 0.0013981999) * fVar38 + 0.008333452) * fVar38 +
                       0.041665796) * fVar38 + 0.16666666) * fVar38 + 0.5) * fVar38 * fVar38) + 1.0;
                auVar117._4_4_ =
                     (float)((int)fVar145 * 0x800000 + 0x3f800000) *
                     (fVar45 + 1.0 +
                     (((((fVar45 * 0.00019875691 + 0.0013981999) * fVar45 + 0.008333452) * fVar45 +
                       0.041665796) * fVar45 + 0.16666666) * fVar45 + 0.5) * fVar45 * fVar45) + 1.0;
                auVar117._8_4_ =
                     (float)((int)fVar146 * 0x800000 + 0x3f800000) *
                     (fVar46 + 1.0 +
                     (((((fVar46 * 0.00019875691 + 0.0013981999) * fVar46 + 0.008333452) * fVar46 +
                       0.041665796) * fVar46 + 0.16666666) * fVar46 + 0.5) * fVar46 * fVar46) + 1.0;
                auVar117._12_4_ =
                     (float)((int)fVar147 * 0x800000 + 0x3f800000) *
                     (fVar47 + 1.0 +
                     (((((fVar47 * 0.00019875691 + 0.0013981999) * fVar47 + 0.008333452) * fVar47 +
                       0.041665796) * fVar47 + 0.16666666) * fVar47 + 0.5) * fVar47 * fVar47) + 1.0;
                auVar133 = maxps(auVar117,_DAT_005a5a80);
                fVar38 = (float)(auVar133._0_4_ & 0x807fffff | 0x3f000000);
                fVar46 = (float)(auVar133._4_4_ & 0x807fffff | 0x3f000000);
                fVar141 = (float)(auVar133._8_4_ & 0x807fffff | 0x3f000000);
                fVar146 = (float)(auVar133._12_4_ & 0x807fffff | 0x3f000000);
                fVar45 = fVar38 + -1.0 + (float)(-(uint)(fVar38 < 0.70710677) & (uint)fVar38);
                fVar47 = fVar46 + -1.0 + (float)(-(uint)(fVar46 < 0.70710677) & (uint)fVar46);
                fVar145 = fVar141 + -1.0 + (float)(-(uint)(fVar141 < 0.70710677) & (uint)fVar141);
                fVar147 = fVar146 + -1.0 + (float)(-(uint)(fVar146 < 0.70710677) & (uint)fVar146);
                auVar118._0_8_ =
                     CONCAT44(-(uint)(auVar117._4_4_ <= 0.0),-(uint)(auVar117._0_4_ <= 0.0)) &
                     0x7fffffff7fffffff;
                auVar118._8_4_ = -(uint)(auVar117._8_4_ <= 0.0) & 0x7fffffff;
                auVar118._12_4_ = -(uint)(auVar117._12_4_ <= 0.0) & 0x7fffffff;
                auVar106._0_4_ =
                     ~-(uint)(auVar117._0_4_ <= 0.0) &
                     (uint)((((float)(int)((auVar133._0_4_ >> 0x17) - 0x7e) -
                             (float)(-(uint)(fVar38 < 0.70710677) & 0x3f800000)) * 0.6931472 +
                             fVar45 + (((((((((fVar45 * 0.070376836 + -0.1151461) * fVar45 +
                                             0.116769984) * fVar45 + -0.12420141) * fVar45 +
                                           0.14249323) * fVar45 + -0.16668057) * fVar45 + 0.20000714
                                         ) * fVar45 + -0.24999994) * fVar45 + 0.3333333) * fVar45 +
                                      -0.5) * fVar45 * fVar45) * -2.0);
                auVar106._4_4_ =
                     ~-(uint)(auVar117._4_4_ <= 0.0) &
                     (uint)((((float)(int)((auVar133._4_4_ >> 0x17) - 0x7e) -
                             (float)(-(uint)(fVar46 < 0.70710677) & 0x3f800000)) * 0.6931472 +
                             fVar47 + (((((((((fVar47 * 0.070376836 + -0.1151461) * fVar47 +
                                             0.116769984) * fVar47 + -0.12420141) * fVar47 +
                                           0.14249323) * fVar47 + -0.16668057) * fVar47 + 0.20000714
                                         ) * fVar47 + -0.24999994) * fVar47 + 0.3333333) * fVar47 +
                                      -0.5) * fVar47 * fVar47) * -2.0);
                auVar106._8_4_ =
                     ~-(uint)(auVar117._8_4_ <= 0.0) &
                     (uint)((((float)(int)((auVar133._8_4_ >> 0x17) - 0x7e) -
                             (float)(-(uint)(fVar141 < 0.70710677) & 0x3f800000)) * 0.6931472 +
                             fVar145 +
                            (((((((((fVar145 * 0.070376836 + -0.1151461) * fVar145 + 0.116769984) *
                                   fVar145 + -0.12420141) * fVar145 + 0.14249323) * fVar145 +
                                -0.16668057) * fVar145 + 0.20000714) * fVar145 + -0.24999994) *
                              fVar145 + 0.3333333) * fVar145 + -0.5) * fVar145 * fVar145) * -2.0);
                auVar106._12_4_ =
                     ~-(uint)(auVar117._12_4_ <= 0.0) &
                     (uint)((((float)(int)((auVar133._12_4_ >> 0x17) - 0x7e) -
                             (float)(-(uint)(fVar146 < 0.70710677) & 0x3f800000)) * 0.6931472 +
                             fVar147 +
                            (((((((((fVar147 * 0.070376836 + -0.1151461) * fVar147 + 0.116769984) *
                                   fVar147 + -0.12420141) * fVar147 + 0.14249323) * fVar147 +
                                -0.16668057) * fVar147 + 0.20000714) * fVar147 + -0.24999994) *
                              fVar147 + 0.3333333) * fVar147 + -0.5) * fVar147 * fVar147) * -2.0);
                auVar133 = minps(auVar106 | auVar118,_DAT_005a59e0);
                auVar133 = maxps(auVar133,_DAT_005a59f0);
                fVar38 = auVar133._0_4_ * 1.442695 + 0.5;
                fVar45 = auVar133._4_4_ * 1.442695 + 0.5;
                fVar46 = auVar133._8_4_ * 1.442695 + 0.5;
                fVar47 = auVar133._12_4_ * 1.442695 + 0.5;
                fVar141 = (float)(int)fVar38;
                fVar145 = (float)(int)fVar45;
                fVar146 = (float)(int)fVar46;
                fVar147 = (float)(int)fVar47;
                fVar141 = fVar141 - (float)(-(uint)(fVar38 < fVar141) & 0x3f800000);
                fVar145 = fVar145 - (float)(-(uint)(fVar45 < fVar145) & 0x3f800000);
                fVar146 = fVar146 - (float)(-(uint)(fVar46 < fVar146) & 0x3f800000);
                fVar147 = fVar147 - (float)(-(uint)(fVar47 < fVar147) & 0x3f800000);
                fVar38 = auVar133._0_4_ - fVar141 * 0.6931472;
                fVar45 = auVar133._4_4_ - fVar145 * 0.6931472;
                fVar46 = auVar133._8_4_ - fVar146 * 0.6931472;
                fVar47 = auVar133._12_4_ - fVar147 * 0.6931472;
                auVar119._0_4_ =
                     (float)((int)fVar141 * 0x800000 + 0x3f800000) *
                     (fVar38 + 1.0 +
                     (((((fVar38 * 0.00019875691 + 0.0013981999) * fVar38 + 0.008333452) * fVar38 +
                       0.041665796) * fVar38 + 0.16666666) * fVar38 + 0.5) * fVar38 * fVar38) + 1.0;
                auVar119._4_4_ =
                     (float)((int)fVar145 * 0x800000 + 0x3f800000) *
                     (fVar45 + 1.0 +
                     (((((fVar45 * 0.00019875691 + 0.0013981999) * fVar45 + 0.008333452) * fVar45 +
                       0.041665796) * fVar45 + 0.16666666) * fVar45 + 0.5) * fVar45 * fVar45) + 1.0;
                auVar119._8_4_ =
                     (float)((int)fVar146 * 0x800000 + 0x3f800000) *
                     (fVar46 + 1.0 +
                     (((((fVar46 * 0.00019875691 + 0.0013981999) * fVar46 + 0.008333452) * fVar46 +
                       0.041665796) * fVar46 + 0.16666666) * fVar46 + 0.5) * fVar46 * fVar46) + 1.0;
                auVar119._12_4_ =
                     (float)((int)fVar147 * 0x800000 + 0x3f800000) *
                     (fVar47 + 1.0 +
                     (((((fVar47 * 0.00019875691 + 0.0013981999) * fVar47 + 0.008333452) * fVar47 +
                       0.041665796) * fVar47 + 0.16666666) * fVar47 + 0.5) * fVar47 * fVar47) + 1.0;
                auVar133 = divps(_DAT_005a66a0,auVar119);
                auVar109._0_4_ = auVar133._0_4_ + -1.0;
                auVar109._4_4_ = auVar133._4_4_ + -1.0;
                auVar109._8_4_ = auVar133._8_4_ + -1.0;
                auVar109._12_4_ = auVar133._12_4_ + -1.0;
                goto LAB_002aed0a;
              case 6:
                pfVar27 = (float *)(this->super_InnerProduct).activation_params.data;
                fVar151 = *pfVar27;
                fVar152 = pfVar27[1];
                auVar63._0_4_ = fVar151 * fVar38 + fVar152;
                auVar63._4_4_ = fVar151 * fVar45 + fVar152;
                auVar63._8_4_ = fVar151 * fVar46 + fVar152;
                auVar63._12_4_ = fVar151 * fVar47 + fVar152;
                auVar130 = maxps(auVar63,ZEXT816(0));
                auVar131 = minps(auVar130,_DAT_005a5a10);
                auVar130._0_4_ = fVar38 * auVar131._0_4_;
                auVar130._4_4_ = fVar45 * auVar131._4_4_;
                auVar130._8_4_ = fVar46 * auVar131._8_4_;
                auVar130._12_4_ = fVar47 * auVar131._12_4_;
                auVar92._0_4_ = fVar151 * fVar140 + fVar152;
                auVar92._4_4_ = fVar151 * fVar148 + fVar152;
                auVar92._8_4_ = fVar151 * fVar149 + fVar152;
                auVar92._12_4_ = fVar151 * fVar150 + fVar152;
                auVar131 = maxps(auVar92,ZEXT816(0));
                auVar131 = minps(auVar131,_DAT_005a5a10);
                auVar103._0_4_ = fVar140 * auVar131._0_4_;
                auVar103._4_4_ = fVar148 * auVar131._4_4_;
                auVar103._8_4_ = fVar149 * auVar131._8_4_;
                auVar103._12_4_ = fVar150 * auVar131._12_4_;
                auVar132._0_4_ = fVar151 * fVar141 + fVar152;
                auVar132._4_4_ = fVar151 * fVar145 + fVar152;
                auVar132._8_4_ = fVar151 * fVar146 + fVar152;
                auVar132._12_4_ = fVar151 * fVar147 + fVar152;
                auVar131 = maxps(auVar132,ZEXT816(0));
                auVar133 = minps(auVar131,_DAT_005a5a10);
                auVar131._0_4_ = fVar141 * auVar133._0_4_;
                auVar131._4_4_ = fVar145 * auVar133._4_4_;
                auVar131._8_4_ = fVar146 * auVar133._8_4_;
                auVar131._12_4_ = fVar147 * auVar133._12_4_;
                auVar133._0_4_ = fVar151 * auVar65._0_4_ + fVar152;
                auVar133._4_4_ = fVar151 * fVar126 + fVar152;
                auVar133._8_4_ = fVar151 * fVar138 + fVar152;
                auVar133._12_4_ = fVar151 * fVar139 + fVar152;
                auVar133 = maxps(auVar133,ZEXT816(0));
                auVar109 = minps(auVar133,_DAT_005a5a10);
LAB_002aed0a:
                auVar65._0_4_ = auVar65._0_4_ * auVar109._0_4_;
                auVar65._4_4_ = fVar126 * auVar109._4_4_;
                auVar65._8_4_ = fVar138 * auVar109._8_4_;
                auVar65._12_4_ = fVar139 * auVar109._12_4_;
              }
              auVar110._0_8_ = auVar130._0_8_;
              auVar110._8_4_ = auVar130._4_4_;
              auVar110._12_4_ = auVar103._4_4_;
              auVar66._4_4_ = auVar103._0_4_;
              auVar66._0_4_ = auVar130._0_4_;
              auVar124._0_8_ = auVar131._0_8_;
              auVar124._8_4_ = auVar131._4_4_;
              auVar124._12_4_ = auVar65._4_4_;
              auVar125._8_8_ = auVar124._8_8_;
              auVar66._12_4_ = auVar65._0_4_;
              auVar66._8_4_ = auVar131._0_4_;
              auVar40._0_8_ = CONCAT44(auVar103._8_4_,auVar130._8_4_);
              auVar40._8_4_ = auVar130._12_4_;
              auVar40._12_4_ = auVar103._12_4_;
              auVar49._0_8_ = CONCAT44(auVar65._8_4_,auVar131._8_4_);
              auVar49._8_4_ = auVar131._12_4_;
              auVar49._12_4_ = auVar65._12_4_;
              auVar125._0_8_ = auVar110._8_8_;
              auVar94._8_8_ = auVar49._0_8_;
              auVar94._0_8_ = auVar40._0_8_;
              auVar50._8_8_ = auVar49._8_8_;
              auVar50._0_8_ = auVar40._8_8_;
              *pauVar20 = auVar66;
              pauVar20[1] = auVar125;
              pauVar20[2] = auVar94;
              pauVar20[3] = auVar50;
              pauVar20 = pauVar20 + 4;
              uVar22 = uVar22 + 1;
            } while (uVar22 != local_88);
            goto LAB_002aed50;
          }
          if (iVar10 == 4 && bVar18 == 0) {
            if (0 < (int)uVar34) {
              pauVar20 = (undefined1 (*) [16])
                         (top_blob->w * lVar36 * top_blob->elemsize + (long)top_blob->data);
              uVar22 = 0;
              do {
                auVar73 = ZEXT816(0);
                auVar55 = ZEXT816(0);
                if (pvVar11 != (void *)0x0) {
                  uVar7 = *(undefined4 *)((long)pvVar11 + uVar22 * 4);
                  auVar55._4_4_ = (float)uVar7;
                  auVar55._0_4_ = (float)uVar7;
                  auVar55._8_4_ = (float)uVar7;
                  auVar55._12_4_ = (float)uVar7;
                }
                pfVar27 = (float *)(uVar22 * (long)(int)uVar9 * 4 +
                                   (long)(this->weight_data_tm).data);
                pauVar28 = (undefined1 (*) [16])
                           (bottom_blob->w * lVar36 * bottom_blob->elemsize +
                           (long)bottom_blob->data);
                uVar32 = 0;
                if ((int)uVar9 < 4) {
                  fVar38 = 0.0;
                  fVar45 = 0.0;
                  fVar46 = 0.0;
                  fVar47 = 0.0;
                  auVar95 = ZEXT816(0);
                }
                else {
                  iVar29 = 3;
                  fVar38 = 0.0;
                  fVar45 = 0.0;
                  fVar46 = 0.0;
                  fVar47 = 0.0;
                  auVar130 = auVar55;
                  auVar131 = auVar73;
                  auVar65 = ZEXT816(0);
                  do {
                    auVar103 = *pauVar28;
                    auVar133 = pauVar28[1];
                    auVar109 = pauVar28[2];
                    auVar63 = pauVar28[3];
                    fVar141 = *pfVar27;
                    fVar145 = pfVar27[1];
                    fVar146 = pfVar27[2];
                    fVar147 = pfVar27[3];
                    auVar55._0_4_ = auVar130._0_4_ + fVar141 * auVar103._0_4_;
                    auVar55._4_4_ = auVar130._4_4_ + fVar141 * auVar103._4_4_;
                    auVar55._8_4_ = auVar130._8_4_ + fVar141 * auVar103._8_4_;
                    auVar55._12_4_ = auVar130._12_4_ + fVar141 * auVar103._12_4_;
                    auVar95._0_4_ = auVar65._0_4_ + fVar145 * auVar133._0_4_;
                    auVar95._4_4_ = auVar65._4_4_ + fVar145 * auVar133._4_4_;
                    auVar95._8_4_ = auVar65._8_4_ + fVar145 * auVar133._8_4_;
                    auVar95._12_4_ = auVar65._12_4_ + fVar145 * auVar133._12_4_;
                    fVar38 = fVar38 + fVar146 * auVar109._0_4_;
                    fVar45 = fVar45 + fVar146 * auVar109._4_4_;
                    fVar46 = fVar46 + fVar146 * auVar109._8_4_;
                    fVar47 = fVar47 + fVar146 * auVar109._12_4_;
                    auVar73._0_4_ = auVar131._0_4_ + fVar147 * auVar63._0_4_;
                    auVar73._4_4_ = auVar131._4_4_ + fVar147 * auVar63._4_4_;
                    auVar73._8_4_ = auVar131._8_4_ + fVar147 * auVar63._8_4_;
                    auVar73._12_4_ = auVar131._12_4_ + fVar147 * auVar63._12_4_;
                    pauVar28 = pauVar28 + 4;
                    pfVar27 = pfVar27 + 4;
                    iVar29 = iVar29 + 4;
                    auVar130 = auVar55;
                    auVar131 = auVar73;
                    auVar65 = auVar95;
                  } while (iVar29 < (int)uVar9);
                  uVar32 = uVar9 & 0xfffffffc;
                }
                if ((int)uVar32 < (int)uVar9) {
                  lVar26 = 0;
                  auVar130 = auVar55;
                  do {
                    auVar131 = *pauVar28;
                    fVar141 = pfVar27[lVar26];
                    auVar55._0_4_ = auVar130._0_4_ + fVar141 * auVar131._0_4_;
                    auVar55._4_4_ = auVar130._4_4_ + fVar141 * auVar131._4_4_;
                    auVar55._8_4_ = auVar130._8_4_ + fVar141 * auVar131._8_4_;
                    auVar55._12_4_ = auVar130._12_4_ + fVar141 * auVar131._12_4_;
                    pauVar28 = pauVar28 + 1;
                    lVar26 = lVar26 + 1;
                    auVar130 = auVar55;
                  } while (uVar9 - uVar32 != (int)lVar26);
                }
                fVar38 = fVar38 + auVar73._0_4_ + auVar95._0_4_ + auVar55._0_4_;
                fVar45 = fVar45 + auVar73._4_4_ + auVar95._4_4_ + auVar55._4_4_;
                auVar44._0_8_ = CONCAT44(fVar45,fVar38);
                auVar44._8_4_ = fVar46 + auVar73._8_4_ + auVar95._8_4_ + auVar55._8_4_;
                auVar44._12_4_ = fVar47 + auVar73._12_4_ + auVar95._12_4_ + auVar55._12_4_;
                fVar46 = (float)DAT_005a40b0;
                fVar47 = DAT_005a40b0._4_4_;
                fVar141 = DAT_005a40b0._8_4_;
                fVar145 = DAT_005a40b0._12_4_;
                switch(iVar19) {
                case 1:
                  auVar44 = maxps(auVar44,_DAT_005a4090);
                  break;
                case 2:
                  auVar59._8_4_ = auVar44._8_4_;
                  auVar59._0_8_ = auVar44._0_8_;
                  auVar59._12_4_ = auVar44._12_4_;
                  auVar131 = maxps(auVar59,ZEXT816(0));
                  auVar130 = minps(auVar44,ZEXT816(0));
                  fVar38 = *(this->super_InnerProduct).activation_params.data;
                  auVar44._4_4_ = fVar38 * auVar130._4_4_ + auVar131._4_4_;
                  auVar44._0_4_ = fVar38 * auVar130._0_4_ + auVar131._0_4_;
                  auVar44._8_4_ = fVar38 * auVar130._8_4_ + auVar131._8_4_;
                  auVar44._12_4_ = fVar38 * auVar130._12_4_ + auVar131._12_4_;
                  break;
                case 3:
                  puVar13 = (undefined4 *)(this->super_InnerProduct).activation_params.data;
                  uVar7 = *puVar13;
                  uVar6 = puVar13[1];
                  auVar58._4_4_ = uVar7;
                  auVar58._0_4_ = uVar7;
                  auVar58._8_4_ = uVar7;
                  auVar58._12_4_ = uVar7;
                  auVar78._4_4_ = uVar6;
                  auVar78._0_4_ = uVar6;
                  auVar78._8_4_ = uVar6;
                  auVar78._12_4_ = uVar6;
                  auVar130 = maxps(auVar44,auVar58);
                  auVar44 = minps(auVar130,auVar78);
                  break;
                case 4:
                  auVar43._0_8_ = CONCAT44(fVar45,fVar38) ^ 0x8000000080000000;
                  auVar43._8_4_ = -auVar44._8_4_;
                  auVar43._12_4_ = -auVar44._12_4_;
                  auVar130 = minps(auVar43,_DAT_005a59e0);
                  auVar130 = maxps(auVar130,_DAT_005a59f0);
                  fVar45 = auVar130._0_4_ * 1.442695 + fVar46;
                  fVar147 = auVar130._4_4_ * 1.442695 + fVar47;
                  fVar138 = auVar130._8_4_ * 1.442695 + fVar141;
                  fVar140 = auVar130._12_4_ * 1.442695 + fVar145;
                  fVar38 = (float)(int)fVar45;
                  fVar146 = (float)(int)fVar147;
                  fVar126 = (float)(int)fVar138;
                  fVar139 = (float)(int)fVar140;
                  fVar148 = (float)DAT_005a5a10;
                  fVar149 = DAT_005a5a10._4_4_;
                  fVar150 = DAT_005a5a10._8_4_;
                  fVar151 = DAT_005a5a10._12_4_;
                  fVar38 = fVar38 - (float)(-(uint)(fVar45 < fVar38) & (uint)fVar148);
                  fVar146 = fVar146 - (float)(-(uint)(fVar147 < fVar146) & (uint)fVar149);
                  fVar126 = fVar126 - (float)(-(uint)(fVar138 < fVar126) & (uint)fVar150);
                  fVar139 = fVar139 - (float)(-(uint)(fVar140 < fVar139) & (uint)fVar151);
                  fVar45 = fVar38 * -0.6931472 + auVar130._0_4_;
                  fVar147 = fVar146 * -0.6931472 + auVar130._4_4_;
                  fVar138 = fVar126 * -0.6931472 + auVar130._8_4_;
                  fVar140 = fVar139 * -0.6931472 + auVar130._12_4_;
                  auVar79._0_4_ =
                       (float)((int)fVar38 * 0x800000 + (int)fVar148) *
                       (fVar45 + fVar148 +
                       (((((fVar45 * 0.00019875691 + 0.0013981999) * fVar45 + 0.008333452) * fVar45
                         + 0.041665796) * fVar45 + 0.16666666) * fVar45 + fVar46) * fVar45 * fVar45)
                       + fVar148;
                  auVar79._4_4_ =
                       (float)((int)fVar146 * 0x800000 + (int)fVar149) *
                       (fVar147 + fVar149 +
                       (((((fVar147 * 0.00019875691 + 0.0013981999) * fVar147 + 0.008333452) *
                          fVar147 + 0.041665796) * fVar147 + 0.16666666) * fVar147 + fVar47) *
                       fVar147 * fVar147) + fVar149;
                  auVar79._8_4_ =
                       (float)((int)fVar126 * 0x800000 + (int)fVar150) *
                       (fVar138 + fVar150 +
                       (((((fVar138 * 0.00019875691 + 0.0013981999) * fVar138 + 0.008333452) *
                          fVar138 + 0.041665796) * fVar138 + 0.16666666) * fVar138 + fVar141) *
                       fVar138 * fVar138) + fVar150;
                  auVar79._12_4_ =
                       (float)((int)fVar139 * 0x800000 + (int)fVar151) *
                       (fVar140 + fVar151 +
                       (((((fVar140 * 0.00019875691 + 0.0013981999) * fVar140 + 0.008333452) *
                          fVar140 + 0.041665796) * fVar140 + 0.16666666) * fVar140 + fVar145) *
                       fVar140 * fVar140) + fVar151;
                  auVar44 = divps(_DAT_005a5a10,auVar79);
                  break;
                case 5:
                  auVar56._8_4_ = auVar44._8_4_;
                  auVar56._0_8_ = auVar44._0_8_;
                  auVar56._12_4_ = auVar44._12_4_;
                  auVar130 = minps(auVar56,_DAT_005a59e0);
                  auVar130 = maxps(auVar130,_DAT_005a59f0);
                  fVar146 = auVar130._0_4_ * 1.442695 + fVar46;
                  fVar147 = auVar130._4_4_ * 1.442695 + fVar47;
                  fVar126 = auVar130._8_4_ * 1.442695 + fVar141;
                  fVar138 = auVar130._12_4_ * 1.442695 + fVar145;
                  fVar139 = (float)(int)fVar146;
                  fVar140 = (float)(int)fVar147;
                  fVar148 = (float)(int)fVar126;
                  fVar149 = (float)(int)fVar138;
                  fVar139 = fVar139 - (float)(-(uint)(fVar146 < fVar139) & 0x3f800000);
                  fVar140 = fVar140 - (float)(-(uint)(fVar147 < fVar140) & 0x3f800000);
                  fVar148 = fVar148 - (float)(-(uint)(fVar126 < fVar148) & 0x3f800000);
                  fVar149 = fVar149 - (float)(-(uint)(fVar138 < fVar149) & 0x3f800000);
                  fVar146 = auVar130._0_4_ - fVar139 * 0.6931472;
                  fVar147 = auVar130._4_4_ - fVar140 * 0.6931472;
                  fVar126 = auVar130._8_4_ - fVar148 * 0.6931472;
                  fVar138 = auVar130._12_4_ - fVar149 * 0.6931472;
                  auVar74._0_4_ =
                       (float)((int)fVar139 * 0x800000 + 0x3f800000) *
                       (fVar146 + 1.0 +
                       (((((fVar146 * 0.00019875691 + 0.0013981999) * fVar146 + 0.008333452) *
                          fVar146 + 0.041665796) * fVar146 + 0.16666666) * fVar146 + fVar46) *
                       fVar146 * fVar146) + 1.0;
                  auVar74._4_4_ =
                       (float)((int)fVar140 * 0x800000 + 0x3f800000) *
                       (fVar147 + 1.0 +
                       (((((fVar147 * 0.00019875691 + 0.0013981999) * fVar147 + 0.008333452) *
                          fVar147 + 0.041665796) * fVar147 + 0.16666666) * fVar147 + fVar47) *
                       fVar147 * fVar147) + 1.0;
                  auVar74._8_4_ =
                       (float)((int)fVar148 * 0x800000 + 0x3f800000) *
                       (fVar126 + 1.0 +
                       (((((fVar126 * 0.00019875691 + 0.0013981999) * fVar126 + 0.008333452) *
                          fVar126 + 0.041665796) * fVar126 + 0.16666666) * fVar126 + fVar141) *
                       fVar126 * fVar126) + 1.0;
                  auVar74._12_4_ =
                       (float)((int)fVar149 * 0x800000 + 0x3f800000) *
                       (fVar138 + 1.0 +
                       (((((fVar138 * 0.00019875691 + 0.0013981999) * fVar138 + 0.008333452) *
                          fVar138 + 0.041665796) * fVar138 + 0.16666666) * fVar138 + fVar145) *
                       fVar138 * fVar138) + 1.0;
                  auVar130 = maxps(auVar74,_DAT_005a5a80);
                  auVar75._0_8_ = auVar130._0_8_ & 0x807fffff807fffff;
                  auVar75._8_4_ = auVar130._8_4_ & 0x807fffff;
                  auVar75._12_4_ = auVar130._12_4_ & 0x807fffff;
                  auVar75 = auVar75 | _DAT_005a40b0;
                  fVar146 = auVar75._0_4_;
                  fVar126 = auVar75._4_4_;
                  fVar139 = auVar75._8_4_;
                  fVar148 = auVar75._12_4_;
                  fVar147 = fVar146 + (float)DAT_005a5ac0 +
                            (float)(-(uint)(fVar146 < 0.70710677) & (uint)fVar146);
                  fVar138 = fVar126 + DAT_005a5ac0._4_4_ +
                            (float)(-(uint)(fVar126 < 0.70710677) & (uint)fVar126);
                  fVar140 = fVar139 + DAT_005a5ac0._8_4_ +
                            (float)(-(uint)(fVar139 < 0.70710677) & (uint)fVar139);
                  fVar149 = fVar148 + DAT_005a5ac0._12_4_ +
                            (float)(-(uint)(fVar148 < 0.70710677) & (uint)fVar148);
                  auVar76._0_4_ =
                       ~-(uint)(auVar74._0_4_ <= 0.0) &
                       (uint)((((float)(int)((auVar130._0_4_ >> 0x17) - 0x7e) -
                               (float)(-(uint)(fVar146 < 0.70710677) & 0x3f800000)) * 0.6931472 +
                               fVar147 +
                              (((((((((fVar147 * 0.070376836 + -0.1151461) * fVar147 + 0.116769984)
                                     * fVar147 + -0.12420141) * fVar147 + 0.14249323) * fVar147 +
                                  -0.16668057) * fVar147 + 0.20000714) * fVar147 + -0.24999994) *
                                fVar147 + 0.3333333) * fVar147 + -0.5) * fVar147 * fVar147) * -2.0);
                  auVar76._4_4_ =
                       ~-(uint)(auVar74._4_4_ <= 0.0) &
                       (uint)((((float)(int)((auVar130._4_4_ >> 0x17) - 0x7e) -
                               (float)(-(uint)(fVar126 < 0.70710677) & 0x3f800000)) * 0.6931472 +
                               fVar138 +
                              (((((((((fVar138 * 0.070376836 + -0.1151461) * fVar138 + 0.116769984)
                                     * fVar138 + -0.12420141) * fVar138 + 0.14249323) * fVar138 +
                                  -0.16668057) * fVar138 + 0.20000714) * fVar138 + -0.24999994) *
                                fVar138 + 0.3333333) * fVar138 + -0.5) * fVar138 * fVar138) * -2.0);
                  auVar76._8_4_ =
                       ~-(uint)(auVar74._8_4_ <= 0.0) &
                       (uint)((((float)(int)((auVar130._8_4_ >> 0x17) - 0x7e) -
                               (float)(-(uint)(fVar139 < 0.70710677) & 0x3f800000)) * 0.6931472 +
                               fVar140 +
                              (((((((((fVar140 * 0.070376836 + -0.1151461) * fVar140 + 0.116769984)
                                     * fVar140 + -0.12420141) * fVar140 + 0.14249323) * fVar140 +
                                  -0.16668057) * fVar140 + 0.20000714) * fVar140 + -0.24999994) *
                                fVar140 + 0.3333333) * fVar140 + -0.5) * fVar140 * fVar140) * -2.0);
                  auVar76._12_4_ =
                       ~-(uint)(auVar74._12_4_ <= 0.0) &
                       (uint)((((float)(int)((auVar130._12_4_ >> 0x17) - 0x7e) -
                               (float)(-(uint)(fVar148 < 0.70710677) & 0x3f800000)) * 0.6931472 +
                               fVar149 +
                              (((((((((fVar149 * 0.070376836 + -0.1151461) * fVar149 + 0.116769984)
                                     * fVar149 + -0.12420141) * fVar149 + 0.14249323) * fVar149 +
                                  -0.16668057) * fVar149 + 0.20000714) * fVar149 + -0.24999994) *
                                fVar149 + 0.3333333) * fVar149 + -0.5) * fVar149 * fVar149) * -2.0);
                  auVar57._0_8_ =
                       CONCAT44(-(uint)(auVar74._4_4_ <= 0.0),-(uint)(auVar74._0_4_ <= 0.0)) &
                       0x7fffffff7fffffff;
                  auVar57._8_4_ = -(uint)(auVar74._8_4_ <= 0.0) & 0x7fffffff;
                  auVar57._12_4_ = -(uint)(auVar74._12_4_ <= 0.0) & 0x7fffffff;
                  auVar130 = minps(auVar57 | auVar76,_DAT_005a59e0);
                  auVar130 = maxps(auVar130,_DAT_005a59f0);
                  fVar146 = auVar130._0_4_ * 1.442695 + fVar46;
                  fVar147 = auVar130._4_4_ * 1.442695 + fVar47;
                  fVar126 = auVar130._8_4_ * 1.442695 + fVar141;
                  fVar138 = auVar130._12_4_ * 1.442695 + fVar145;
                  fVar139 = (float)(int)fVar146;
                  fVar140 = (float)(int)fVar147;
                  fVar148 = (float)(int)fVar126;
                  fVar149 = (float)(int)fVar138;
                  fVar139 = fVar139 - (float)(-(uint)(fVar146 < fVar139) & 0x3f800000);
                  fVar140 = fVar140 - (float)(-(uint)(fVar147 < fVar140) & 0x3f800000);
                  fVar148 = fVar148 - (float)(-(uint)(fVar126 < fVar148) & 0x3f800000);
                  fVar149 = fVar149 - (float)(-(uint)(fVar138 < fVar149) & 0x3f800000);
                  fVar146 = auVar130._0_4_ - fVar139 * 0.6931472;
                  fVar147 = auVar130._4_4_ - fVar140 * 0.6931472;
                  fVar126 = auVar130._8_4_ - fVar148 * 0.6931472;
                  fVar138 = auVar130._12_4_ - fVar149 * 0.6931472;
                  auVar77._0_4_ =
                       (float)((int)fVar139 * 0x800000 + 0x3f800000) *
                       (fVar146 + 1.0 +
                       (((((fVar146 * 0.00019875691 + 0.0013981999) * fVar146 + 0.008333452) *
                          fVar146 + 0.041665796) * fVar146 + 0.16666666) * fVar146 + fVar46) *
                       fVar146 * fVar146) + 1.0;
                  auVar77._4_4_ =
                       (float)((int)fVar140 * 0x800000 + 0x3f800000) *
                       (fVar147 + 1.0 +
                       (((((fVar147 * 0.00019875691 + 0.0013981999) * fVar147 + 0.008333452) *
                          fVar147 + 0.041665796) * fVar147 + 0.16666666) * fVar147 + fVar47) *
                       fVar147 * fVar147) + 1.0;
                  auVar77._8_4_ =
                       (float)((int)fVar148 * 0x800000 + 0x3f800000) *
                       (fVar126 + 1.0 +
                       (((((fVar126 * 0.00019875691 + 0.0013981999) * fVar126 + 0.008333452) *
                          fVar126 + 0.041665796) * fVar126 + 0.16666666) * fVar126 + fVar141) *
                       fVar126 * fVar126) + 1.0;
                  auVar77._12_4_ =
                       (float)((int)fVar149 * 0x800000 + 0x3f800000) *
                       (fVar138 + 1.0 +
                       (((((fVar138 * 0.00019875691 + 0.0013981999) * fVar138 + 0.008333452) *
                          fVar138 + 0.041665796) * fVar138 + 0.16666666) * fVar138 + fVar145) *
                       fVar138 * fVar138) + 1.0;
                  auVar130 = divps(_DAT_005a66a0,auVar77);
                  auVar61._0_4_ = auVar130._0_4_ + (float)DAT_005a5ac0;
                  auVar61._4_4_ = auVar130._4_4_ + DAT_005a5ac0._4_4_;
                  auVar61._8_4_ = auVar130._8_4_ + DAT_005a5ac0._8_4_;
                  auVar61._12_4_ = auVar130._12_4_ + DAT_005a5ac0._12_4_;
                  goto LAB_002af628;
                case 6:
                  pfVar27 = (float *)(this->super_InnerProduct).activation_params.data;
                  fVar46 = *pfVar27;
                  fVar47 = pfVar27[1];
                  auVar60._0_4_ = fVar46 * fVar38 + fVar47;
                  auVar60._4_4_ = fVar46 * fVar45 + fVar47;
                  auVar60._8_4_ = fVar46 * auVar44._8_4_ + fVar47;
                  auVar60._12_4_ = fVar46 * auVar44._12_4_ + fVar47;
                  auVar130 = maxps(auVar60,_DAT_005a4090);
                  auVar61 = minps(auVar130,_DAT_005a5a10);
LAB_002af628:
                  auVar44._0_4_ = fVar38 * auVar61._0_4_;
                  auVar44._4_4_ = fVar45 * auVar61._4_4_;
                  auVar44._8_4_ = auVar44._8_4_ * auVar61._8_4_;
                  auVar44._12_4_ = auVar44._12_4_ * auVar61._12_4_;
                }
                *pauVar20 = auVar44;
                pauVar20 = pauVar20 + 1;
                uVar22 = uVar22 + 1;
              } while (uVar22 != uVar34);
              goto LAB_002af640;
            }
          }
          else {
LAB_002af640:
            if ((0 < (int)uVar34 && iVar10 == 1) && bVar18 == 0) {
              pfVar35 = (float *)(top_blob->w * lVar36 * top_blob->elemsize + (long)top_blob->data);
              pfVar27 = (float *)(this->super_InnerProduct).activation_params.data;
              pvVar12 = (this->weight_data_tm).data;
              pfVar37 = (float *)(bottom_blob->w * lVar36 * bottom_blob->elemsize +
                                 (long)bottom_blob->data);
              uVar22 = 0;
              do {
                if (pvVar11 == (void *)0x0) {
                  fVar38 = 0.0;
                }
                else {
                  fVar38 = *(float *)((long)pvVar11 + uVar22 * 4);
                }
                pfVar21 = (float *)(uVar22 * (long)(int)uVar9 * 4 + (long)pvVar12);
                pfVar23 = pfVar37;
                if ((int)uVar9 < 4) {
                  uVar32 = 0;
                  auVar62 = ZEXT816(0);
                }
                else {
                  iVar29 = 3;
                  auVar130 = ZEXT816(0);
                  do {
                    auVar62._0_4_ = auVar130._0_4_ + *pfVar21 * *pfVar23;
                    auVar62._4_4_ = auVar130._4_4_ + pfVar21[1] * pfVar23[1];
                    auVar62._8_4_ = auVar130._8_4_ + pfVar21[2] * pfVar23[2];
                    auVar62._12_4_ = auVar130._12_4_ + pfVar21[3] * pfVar23[3];
                    pfVar23 = pfVar23 + 4;
                    pfVar21 = pfVar21 + 4;
                    iVar29 = iVar29 + 4;
                    auVar130 = auVar62;
                  } while (iVar29 < (int)uVar9);
                  uVar32 = uVar9 & 0xfffffffc;
                }
                if ((int)uVar32 < (int)uVar9) {
                  lVar26 = 0;
                  do {
                    fVar38 = fVar38 + pfVar21[lVar26] * pfVar23[lVar26];
                    lVar26 = lVar26 + 1;
                  } while (uVar9 - uVar32 != (int)lVar26);
                }
                fVar38 = auVar62._12_4_ + auVar62._4_4_ + auVar62._8_4_ + auVar62._0_4_ + fVar38;
                fVar45 = fVar38;
                switch(iVar19) {
                case 1:
                  if (fVar38 <= 0.0) {
                    fVar45 = 0.0;
                  }
                  break;
                case 2:
                  fVar45 = (float)(~-(uint)(0.0 < fVar38) & (uint)*pfVar27 |
                                  -(uint)(0.0 < fVar38) & 0x3f800000) * fVar38;
                  break;
                case 3:
                  if (fVar38 <= *pfVar27) {
                    fVar38 = *pfVar27;
                  }
                  fVar45 = pfVar27[1];
                  if (fVar38 <= pfVar27[1]) {
                    fVar45 = fVar38;
                  }
                  break;
                case 4:
                  if (88.37626 <= fVar38) {
                    fVar38 = 88.37626;
                  }
                  fVar38 = expf((float)(-(uint)(fVar38 < -88.37626) & 0x42b0c0a5 |
                                       ~-(uint)(fVar38 < -88.37626) & (uint)-fVar38));
                  fVar45 = 1.0 / (fVar38 + 1.0);
                  break;
                case 5:
                  fVar45 = expf(fVar38);
                  fVar45 = logf(fVar45 + 1.0);
                  fVar45 = tanhf(fVar45);
                  fVar45 = fVar45 * fVar38;
                  break;
                case 6:
                  fVar46 = *pfVar27;
                  fVar47 = -pfVar27[1] / fVar46;
                  fVar45 = 0.0;
                  if ((fVar47 <= fVar38) && (fVar45 = fVar38, fVar38 <= fVar47 + 1.0 / fVar46)) {
                    fVar45 = (fVar46 * fVar38 + pfVar27[1]) * fVar38;
                  }
                }
                *pfVar35 = fVar45;
                pfVar35 = pfVar35 + 1;
                uVar22 = uVar22 + 1;
              } while (uVar22 != uVar34);
            }
          }
          lVar36 = lVar36 + 1;
        } while (lVar36 != local_80);
      }
      return 0;
    }
  }
  else {
    local_a4 = bottom_blob->w;
  }
  local_d0 = (float *)bottom_blob->data;
  local_c8 = bottom_blob->refcount;
  local_c0 = bottom_blob->elemsize;
  local_b8 = bottom_blob->elempack;
  local_b0 = bottom_blob->allocator;
  local_a0._0_4_ = bottom_blob->h;
  local_a0._4_4_ = bottom_blob->d;
  local_98 = bottom_blob->c;
  local_90 = bottom_blob->cstep;
  iVar19 = local_a8;
  if (local_c8 != (int *)0x0) {
    LOCK();
    *local_c8 = *local_c8 + 1;
    UNLOCK();
    iVar19 = bottom_blob->dims;
  }
  if (iVar19 != 1) {
    local_78._0_1_ = opt->lightmode;
    local_78._1_1_ = opt->use_shader_pack8;
    local_78._2_1_ = opt->use_subgroup_ops;
    local_78._3_1_ = opt->use_reserved_0;
    local_78._4_4_ = opt->num_threads;
    local_68 = opt->workspace_allocator;
    uStack_60._0_4_ = opt->openmp_blocktime;
    uStack_60._4_1_ = opt->use_winograd_convolution;
    uStack_60._5_1_ = opt->use_sgemm_convolution;
    uStack_60._6_1_ = opt->use_int8_inference;
    uStack_60._7_1_ = opt->use_vulkan_compute;
    local_58[0] = opt->use_bf16_storage;
    local_58[1] = opt->use_fp16_packed;
    local_58[2] = opt->use_fp16_storage;
    local_58[3] = opt->use_fp16_arithmetic;
    local_58[4] = opt->use_int8_packed;
    local_58[5] = opt->use_int8_storage;
    local_58[6] = opt->use_int8_arithmetic;
    local_58[7] = opt->use_packing_layout;
    local_58._8_4_ = opt->vulkan_device_index;
    local_58[0xc] = opt->use_reserved_1;
    local_58[0xd] = opt->use_image_storage;
    local_58[0xe] = opt->use_tensor_storage;
    local_58[0xf] = opt->use_reserved_2;
    local_48._0_4_ = opt->flush_denormals;
    local_48[4] = opt->use_local_pool_allocator;
    local_48[5] = opt->use_shader_local_memory;
    local_48[6] = opt->use_cooperative_matrix;
    local_48[7] = opt->use_winograd23_convolution;
    local_48[8] = opt->use_winograd43_convolution;
    local_48[9] = opt->use_winograd63_convolution;
    local_48[10] = opt->use_a53_a55_optimized_kernel;
    local_48[0xb] = opt->use_fp16_uniform;
    local_48[0xc] = opt->use_int8_uniform;
    local_48[0xd] = opt->use_reserved_9;
    local_48[0xe] = opt->use_reserved_10;
    local_48[0xf] = opt->use_reserved_11;
    pAStack_70 = opt->workspace_allocator;
    (*this->flatten->_vptr_Layer[7])(this->flatten,bottom_blob,&local_d0);
    if ((local_d0 == (float *)0x0) || ((long)local_98 * local_90 == 0)) {
      iVar19 = -100;
      goto LAB_002b071b;
    }
  }
  uVar9 = (this->super_InnerProduct).num_output;
  bVar18 = (uVar9 & 3) == 0 & opt->use_packing_layout;
  iVar19 = (uint)bVar18 + (uint)bVar18 * 2 + 1;
  Mat::create(top_blob,(int)uVar9 / iVar19,local_c0 / (ulong)(long)local_b8 << bVar18 * '\x02',
              iVar19,opt->blob_allocator);
  pfVar27 = local_d0;
  auVar130 = _DAT_005a5a10;
  iVar19 = -100;
  if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
    iVar10 = (this->super_InnerProduct).activation_type;
    pvVar11 = (this->super_InnerProduct).bias_data.data;
    uVar34 = local_b8 * local_a4;
    uVar9 = top_blob->w;
    fVar38 = (float)DAT_005a5a10;
    fVar45 = DAT_005a5a10._4_4_;
    fVar46 = DAT_005a5a10._8_4_;
    fVar47 = DAT_005a5a10._12_4_;
    if (top_blob->elempack == 1) {
      lVar36 = (long)(int)uVar34;
      if (0 < (int)uVar9 >> 2) {
        lVar24 = lVar36 * 0x10;
        lVar26 = lVar36 * 4;
        lVar31 = lVar36 * 0xc;
        lVar30 = lVar36 * 8;
        lVar33 = 0;
        uVar22 = 0;
        do {
          uVar5 = uVar22 * 4;
          fVar141 = 0.0;
          fVar145 = 0.0;
          fVar146 = 0.0;
          fVar147 = 0.0;
          if (pvVar11 != (void *)0x0) {
            pfVar35 = (float *)((long)pvVar11 + uVar22 * 0x10);
            fVar141 = *pfVar35;
            fVar145 = pfVar35[1];
            fVar146 = pfVar35[2];
            fVar147 = pfVar35[3];
          }
          pvVar12 = (this->weight_data_tm).data;
          if ((int)uVar34 < 4) {
            uVar32 = 0;
            lVar1 = uVar5 * lVar36 * 4;
            lVar2 = (uVar5 | 1) * lVar36 * 4;
            lVar3 = (uVar5 | 2) * lVar36 * 4;
            lVar4 = (uVar5 | 3) * lVar36 * 4;
            fVar126 = 0.0;
            fVar138 = 0.0;
            fVar139 = 0.0;
            fVar140 = 0.0;
            fVar148 = 0.0;
            fVar149 = 0.0;
            fVar150 = 0.0;
            fVar151 = 0.0;
            fVar152 = 0.0;
            fVar154 = 0.0;
            fVar156 = 0.0;
            fVar158 = 0.0;
            fVar153 = 0.0;
            fVar155 = 0.0;
            fVar157 = 0.0;
            fVar159 = 0.0;
            pfVar35 = local_d0;
          }
          else {
            fVar153 = 0.0;
            fVar155 = 0.0;
            fVar157 = 0.0;
            fVar159 = 0.0;
            iVar19 = 3;
            lVar25 = 0;
            fVar152 = 0.0;
            fVar154 = 0.0;
            fVar156 = 0.0;
            fVar158 = 0.0;
            fVar148 = 0.0;
            fVar149 = 0.0;
            fVar150 = 0.0;
            fVar151 = 0.0;
            fVar126 = 0.0;
            fVar138 = 0.0;
            fVar139 = 0.0;
            fVar140 = 0.0;
            do {
              pfVar35 = (float *)((long)local_d0 + lVar25);
              fVar8 = *pfVar35;
              fVar15 = pfVar35[1];
              fVar16 = pfVar35[2];
              fVar17 = pfVar35[3];
              pfVar35 = (float *)((long)pvVar12 + lVar25 + lVar33);
              pfVar37 = (float *)((long)pvVar12 + lVar25 + lVar26);
              pfVar23 = (float *)((long)pvVar12 + lVar25 + lVar30);
              pfVar21 = (float *)((long)pvVar12 + lVar25 + lVar31);
              fVar153 = fVar153 + *pfVar35 * fVar8;
              fVar155 = fVar155 + pfVar35[1] * fVar15;
              fVar157 = fVar157 + pfVar35[2] * fVar16;
              fVar159 = fVar159 + pfVar35[3] * fVar17;
              fVar126 = fVar126 + *pfVar37 * fVar8;
              fVar138 = fVar138 + pfVar37[1] * fVar15;
              fVar139 = fVar139 + pfVar37[2] * fVar16;
              fVar140 = fVar140 + pfVar37[3] * fVar17;
              fVar148 = fVar148 + *pfVar23 * fVar8;
              fVar149 = fVar149 + pfVar23[1] * fVar15;
              fVar150 = fVar150 + pfVar23[2] * fVar16;
              fVar151 = fVar151 + pfVar23[3] * fVar17;
              fVar152 = fVar152 + *pfVar21 * fVar8;
              fVar154 = fVar154 + pfVar21[1] * fVar15;
              fVar156 = fVar156 + pfVar21[2] * fVar16;
              fVar158 = fVar158 + pfVar21[3] * fVar17;
              lVar25 = lVar25 + 0x10;
              iVar19 = iVar19 + 4;
            } while (iVar19 < (int)uVar34);
            lVar1 = lVar25 + lVar33;
            lVar4 = lVar25 + lVar31;
            lVar3 = lVar25 + lVar30;
            lVar2 = lVar25 + lVar26;
            pfVar35 = (float *)((long)local_d0 + lVar25);
            uVar32 = uVar34 & 0xfffffffc;
          }
          if (uVar34 - uVar32 != 0 && (int)uVar32 <= (int)uVar34) {
            lVar25 = 0;
            do {
              fVar8 = pfVar35[lVar25];
              fVar141 = fVar141 + fVar8 * *(float *)((long)pvVar12 + lVar25 * 4 + lVar1);
              fVar145 = fVar145 + fVar8 * *(float *)((long)pvVar12 + lVar25 * 4 + lVar2);
              fVar146 = fVar146 + fVar8 * *(float *)((long)pvVar12 + lVar25 * 4 + lVar3);
              fVar147 = fVar147 + fVar8 * *(float *)((long)pvVar12 + lVar25 * 4 + lVar4);
              lVar25 = lVar25 + 1;
            } while (uVar34 - uVar32 != (int)lVar25);
          }
          fVar141 = fVar159 + fVar157 + fVar155 + fVar153 + fVar141;
          fVar145 = fVar140 + fVar139 + fVar138 + fVar126 + fVar145;
          auVar137._0_8_ = CONCAT44(fVar145,fVar141);
          auVar137._8_4_ = fVar151 + fVar150 + fVar149 + fVar148 + fVar146;
          auVar137._12_4_ = fVar158 + fVar156 + fVar154 + fVar152 + fVar147;
          switch(iVar10) {
          case 1:
            auVar137 = maxps(auVar137,ZEXT816(0));
            break;
          case 2:
            auVar90._8_4_ = auVar137._8_4_;
            auVar90._0_8_ = auVar137._0_8_;
            auVar90._12_4_ = auVar137._12_4_;
            auVar131 = maxps(auVar90,ZEXT816(0));
            auVar65 = minps(auVar137,ZEXT816(0));
            fVar141 = *(this->super_InnerProduct).activation_params.data;
            auVar137._4_4_ = fVar141 * auVar65._4_4_ + auVar131._4_4_;
            auVar137._0_4_ = fVar141 * auVar65._0_4_ + auVar131._0_4_;
            auVar137._8_4_ = fVar141 * auVar65._8_4_ + auVar131._8_4_;
            auVar137._12_4_ = fVar141 * auVar65._12_4_ + auVar131._12_4_;
            break;
          case 3:
            puVar13 = (undefined4 *)(this->super_InnerProduct).activation_params.data;
            uVar7 = *puVar13;
            uVar6 = puVar13[1];
            auVar89._4_4_ = uVar7;
            auVar89._0_4_ = uVar7;
            auVar89._8_4_ = uVar7;
            auVar89._12_4_ = uVar7;
            auVar100._4_4_ = uVar6;
            auVar100._0_4_ = uVar6;
            auVar100._8_4_ = uVar6;
            auVar100._12_4_ = uVar6;
            auVar131 = maxps(auVar137,auVar89);
            auVar137 = minps(auVar131,auVar100);
            break;
          case 4:
            auVar136._0_8_ = CONCAT44(fVar145,fVar141) ^ 0x8000000080000000;
            auVar136._8_4_ = -auVar137._8_4_;
            auVar136._12_4_ = -auVar137._12_4_;
            auVar131 = minps(auVar136,_DAT_005a59e0);
            auVar131 = maxps(auVar131,_DAT_005a59f0);
            fVar145 = auVar131._0_4_ * 1.442695 + 0.5;
            fVar147 = auVar131._4_4_ * 1.442695 + 0.5;
            fVar138 = auVar131._8_4_ * 1.442695 + 0.5;
            fVar140 = auVar131._12_4_ * 1.442695 + 0.5;
            fVar141 = (float)(int)fVar145;
            fVar146 = (float)(int)fVar147;
            fVar126 = (float)(int)fVar138;
            fVar139 = (float)(int)fVar140;
            fVar141 = fVar141 - (float)(-(uint)(fVar145 < fVar141) & (uint)fVar38);
            fVar146 = fVar146 - (float)(-(uint)(fVar147 < fVar146) & (uint)fVar45);
            fVar126 = fVar126 - (float)(-(uint)(fVar138 < fVar126) & (uint)fVar46);
            fVar139 = fVar139 - (float)(-(uint)(fVar140 < fVar139) & (uint)fVar47);
            fVar145 = fVar141 * -0.6931472 + auVar131._0_4_;
            fVar147 = fVar146 * -0.6931472 + auVar131._4_4_;
            fVar138 = fVar126 * -0.6931472 + auVar131._8_4_;
            fVar140 = fVar139 * -0.6931472 + auVar131._12_4_;
            auVar101._0_4_ =
                 (float)((int)fVar141 * 0x800000 + (int)fVar38) *
                 (fVar145 + fVar38 +
                 (((((fVar145 * 0.00019875691 + 0.0013981999) * fVar145 + 0.008333452) * fVar145 +
                   0.041665796) * fVar145 + 0.16666666) * fVar145 + 0.5) * fVar145 * fVar145) +
                 fVar38;
            auVar101._4_4_ =
                 (float)((int)fVar146 * 0x800000 + (int)fVar45) *
                 (fVar147 + fVar45 +
                 (((((fVar147 * 0.00019875691 + 0.0013981999) * fVar147 + 0.008333452) * fVar147 +
                   0.041665796) * fVar147 + 0.16666666) * fVar147 + 0.5) * fVar147 * fVar147) +
                 fVar45;
            auVar101._8_4_ =
                 (float)((int)fVar126 * 0x800000 + (int)fVar46) *
                 (fVar138 + fVar46 +
                 (((((fVar138 * 0.00019875691 + 0.0013981999) * fVar138 + 0.008333452) * fVar138 +
                   0.041665796) * fVar138 + 0.16666666) * fVar138 + 0.5) * fVar138 * fVar138) +
                 fVar46;
            auVar101._12_4_ =
                 (float)((int)fVar139 * 0x800000 + (int)fVar47) *
                 (fVar140 + fVar47 +
                 (((((fVar140 * 0.00019875691 + 0.0013981999) * fVar140 + 0.008333452) * fVar140 +
                   0.041665796) * fVar140 + 0.16666666) * fVar140 + 0.5) * fVar140 * fVar140) +
                 fVar47;
            auVar137 = divps(auVar130,auVar101);
            break;
          case 5:
            auVar143._8_4_ = auVar137._8_4_;
            auVar143._0_8_ = auVar137._0_8_;
            auVar143._12_4_ = auVar137._12_4_;
            auVar131 = minps(auVar143,_DAT_005a59e0);
            auVar131 = maxps(auVar131,_DAT_005a59f0);
            fVar146 = auVar131._0_4_ * 1.442695 + 0.5;
            fVar147 = auVar131._4_4_ * 1.442695 + 0.5;
            fVar126 = auVar131._8_4_ * 1.442695 + 0.5;
            fVar138 = auVar131._12_4_ * 1.442695 + 0.5;
            fVar139 = (float)(int)fVar146;
            fVar140 = (float)(int)fVar147;
            fVar148 = (float)(int)fVar126;
            fVar149 = (float)(int)fVar138;
            fVar139 = fVar139 - (float)(-(uint)(fVar146 < fVar139) & (uint)fVar38);
            fVar140 = fVar140 - (float)(-(uint)(fVar147 < fVar140) & (uint)fVar45);
            fVar148 = fVar148 - (float)(-(uint)(fVar126 < fVar148) & (uint)fVar46);
            fVar149 = fVar149 - (float)(-(uint)(fVar138 < fVar149) & (uint)fVar47);
            fVar146 = auVar131._0_4_ - fVar139 * 0.6931472;
            fVar147 = auVar131._4_4_ - fVar140 * 0.6931472;
            fVar126 = auVar131._8_4_ - fVar148 * 0.6931472;
            fVar138 = auVar131._12_4_ - fVar149 * 0.6931472;
            auVar86._0_4_ =
                 (float)((int)fVar139 * 0x800000 + (int)fVar38) *
                 (fVar146 + fVar38 +
                 (((((fVar146 * 0.00019875691 + 0.0013981999) * fVar146 + 0.008333452) * fVar146 +
                   0.041665796) * fVar146 + 0.16666666) * fVar146 + 0.5) * fVar146 * fVar146) +
                 fVar38;
            auVar86._4_4_ =
                 (float)((int)fVar140 * 0x800000 + (int)fVar45) *
                 (fVar147 + fVar45 +
                 (((((fVar147 * 0.00019875691 + 0.0013981999) * fVar147 + 0.008333452) * fVar147 +
                   0.041665796) * fVar147 + 0.16666666) * fVar147 + 0.5) * fVar147 * fVar147) +
                 fVar45;
            auVar86._8_4_ =
                 (float)((int)fVar148 * 0x800000 + (int)fVar46) *
                 (fVar126 + fVar46 +
                 (((((fVar126 * 0.00019875691 + 0.0013981999) * fVar126 + 0.008333452) * fVar126 +
                   0.041665796) * fVar126 + 0.16666666) * fVar126 + 0.5) * fVar126 * fVar126) +
                 fVar46;
            auVar86._12_4_ =
                 (float)((int)fVar149 * 0x800000 + (int)fVar47) *
                 (fVar138 + fVar47 +
                 (((((fVar138 * 0.00019875691 + 0.0013981999) * fVar138 + 0.008333452) * fVar138 +
                   0.041665796) * fVar138 + 0.16666666) * fVar138 + 0.5) * fVar138 * fVar138) +
                 fVar47;
            auVar131 = maxps(auVar86,_DAT_005a5a80);
            fVar146 = (float)(auVar131._0_4_ & 0x807fffff | 0x3f000000);
            fVar126 = (float)(auVar131._4_4_ & 0x807fffff | 0x3f000000);
            fVar139 = (float)(auVar131._8_4_ & 0x807fffff | 0x3f000000);
            fVar148 = (float)(auVar131._12_4_ & 0x807fffff | 0x3f000000);
            fVar147 = fVar146 + -1.0 + (float)(-(uint)(fVar146 < 0.70710677) & (uint)fVar146);
            fVar138 = fVar126 + -1.0 + (float)(-(uint)(fVar126 < 0.70710677) & (uint)fVar126);
            fVar140 = fVar139 + -1.0 + (float)(-(uint)(fVar139 < 0.70710677) & (uint)fVar139);
            fVar149 = fVar148 + -1.0 + (float)(-(uint)(fVar148 < 0.70710677) & (uint)fVar148);
            auVar87._0_4_ =
                 ~-(uint)(auVar86._0_4_ <= 0.0) &
                 (uint)((((float)(int)((auVar131._0_4_ >> 0x17) - 0x7e) -
                         (float)(-(uint)(fVar146 < 0.70710677) & (uint)fVar38)) * 0.6931472 +
                         fVar147 +
                        (((((((((fVar147 * 0.070376836 + -0.1151461) * fVar147 + 0.116769984) *
                               fVar147 + -0.12420141) * fVar147 + 0.14249323) * fVar147 +
                            -0.16668057) * fVar147 + 0.20000714) * fVar147 + -0.24999994) * fVar147
                         + 0.3333333) * fVar147 + -0.5) * fVar147 * fVar147) * -2.0);
            auVar87._4_4_ =
                 ~-(uint)(auVar86._4_4_ <= 0.0) &
                 (uint)((((float)(int)((auVar131._4_4_ >> 0x17) - 0x7e) -
                         (float)(-(uint)(fVar126 < 0.70710677) & (uint)fVar45)) * 0.6931472 +
                         fVar138 +
                        (((((((((fVar138 * 0.070376836 + -0.1151461) * fVar138 + 0.116769984) *
                               fVar138 + -0.12420141) * fVar138 + 0.14249323) * fVar138 +
                            -0.16668057) * fVar138 + 0.20000714) * fVar138 + -0.24999994) * fVar138
                         + 0.3333333) * fVar138 + -0.5) * fVar138 * fVar138) * -2.0);
            auVar87._8_4_ =
                 ~-(uint)(auVar86._8_4_ <= 0.0) &
                 (uint)((((float)(int)((auVar131._8_4_ >> 0x17) - 0x7e) -
                         (float)(-(uint)(fVar139 < 0.70710677) & (uint)fVar46)) * 0.6931472 +
                         fVar140 +
                        (((((((((fVar140 * 0.070376836 + -0.1151461) * fVar140 + 0.116769984) *
                               fVar140 + -0.12420141) * fVar140 + 0.14249323) * fVar140 +
                            -0.16668057) * fVar140 + 0.20000714) * fVar140 + -0.24999994) * fVar140
                         + 0.3333333) * fVar140 + -0.5) * fVar140 * fVar140) * -2.0);
            auVar87._12_4_ =
                 ~-(uint)(auVar86._12_4_ <= 0.0) &
                 (uint)((((float)(int)((auVar131._12_4_ >> 0x17) - 0x7e) -
                         (float)(-(uint)(fVar148 < 0.70710677) & (uint)fVar47)) * 0.6931472 +
                         fVar149 +
                        (((((((((fVar149 * 0.070376836 + -0.1151461) * fVar149 + 0.116769984) *
                               fVar149 + -0.12420141) * fVar149 + 0.14249323) * fVar149 +
                            -0.16668057) * fVar149 + 0.20000714) * fVar149 + -0.24999994) * fVar149
                         + 0.3333333) * fVar149 + -0.5) * fVar149 * fVar149) * -2.0);
            auVar144._0_8_ =
                 CONCAT44(-(uint)(auVar86._4_4_ <= 0.0),-(uint)(auVar86._0_4_ <= 0.0)) &
                 0x7fffffff7fffffff;
            auVar144._8_4_ = -(uint)(auVar86._8_4_ <= 0.0) & 0x7fffffff;
            auVar144._12_4_ = -(uint)(auVar86._12_4_ <= 0.0) & 0x7fffffff;
            auVar131 = minps(auVar144 | auVar87,_DAT_005a59e0);
            auVar131 = maxps(auVar131,_DAT_005a59f0);
            fVar139 = auVar131._0_4_ * 1.442695 + 0.5;
            fVar140 = auVar131._4_4_ * 1.442695 + 0.5;
            fVar148 = auVar131._8_4_ * 1.442695 + 0.5;
            fVar149 = auVar131._12_4_ * 1.442695 + 0.5;
            fVar146 = (float)(int)fVar139;
            fVar147 = (float)(int)fVar140;
            fVar126 = (float)(int)fVar148;
            fVar138 = (float)(int)fVar149;
            fVar146 = fVar146 - (float)(-(uint)(fVar139 < fVar146) & (uint)fVar38);
            fVar147 = fVar147 - (float)(-(uint)(fVar140 < fVar147) & (uint)fVar45);
            fVar126 = fVar126 - (float)(-(uint)(fVar148 < fVar126) & (uint)fVar46);
            fVar138 = fVar138 - (float)(-(uint)(fVar149 < fVar138) & (uint)fVar47);
            fVar139 = auVar131._0_4_ - fVar146 * 0.6931472;
            fVar140 = auVar131._4_4_ - fVar147 * 0.6931472;
            fVar148 = auVar131._8_4_ - fVar126 * 0.6931472;
            fVar149 = auVar131._12_4_ - fVar138 * 0.6931472;
            auVar88._0_4_ =
                 (float)((int)fVar146 * 0x800000 + (int)fVar38) *
                 (fVar139 + fVar38 +
                 (((((fVar139 * 0.00019875691 + 0.0013981999) * fVar139 + 0.008333452) * fVar139 +
                   0.041665796) * fVar139 + 0.16666666) * fVar139 + 0.5) * fVar139 * fVar139) +
                 fVar38;
            auVar88._4_4_ =
                 (float)((int)fVar147 * 0x800000 + (int)fVar45) *
                 (fVar140 + fVar45 +
                 (((((fVar140 * 0.00019875691 + 0.0013981999) * fVar140 + 0.008333452) * fVar140 +
                   0.041665796) * fVar140 + 0.16666666) * fVar140 + 0.5) * fVar140 * fVar140) +
                 fVar45;
            auVar88._8_4_ =
                 (float)((int)fVar126 * 0x800000 + (int)fVar46) *
                 (fVar148 + fVar46 +
                 (((((fVar148 * 0.00019875691 + 0.0013981999) * fVar148 + 0.008333452) * fVar148 +
                   0.041665796) * fVar148 + 0.16666666) * fVar148 + 0.5) * fVar148 * fVar148) +
                 fVar46;
            auVar88._12_4_ =
                 (float)((int)fVar138 * 0x800000 + (int)fVar47) *
                 (fVar149 + fVar47 +
                 (((((fVar149 * 0.00019875691 + 0.0013981999) * fVar149 + 0.008333452) * fVar149 +
                   0.041665796) * fVar149 + 0.16666666) * fVar149 + 0.5) * fVar149 * fVar149) +
                 fVar47;
            auVar131 = divps(_DAT_005a66a0,auVar88);
            auVar137._0_4_ = fVar141 * (auVar131._0_4_ + -1.0);
            auVar137._4_4_ = fVar145 * (auVar131._4_4_ + -1.0);
            auVar137._8_4_ = auVar137._8_4_ * (auVar131._8_4_ + -1.0);
            auVar137._12_4_ = auVar137._12_4_ * (auVar131._12_4_ + -1.0);
            break;
          case 6:
            pfVar35 = (float *)(this->super_InnerProduct).activation_params.data;
            fVar146 = *pfVar35;
            fVar147 = pfVar35[1];
            auVar91._0_4_ = fVar146 * fVar141 + fVar147;
            auVar91._4_4_ = fVar146 * fVar145 + fVar147;
            auVar91._8_4_ = fVar146 * auVar137._8_4_ + fVar147;
            auVar91._12_4_ = fVar146 * auVar137._12_4_ + fVar147;
            auVar131 = maxps(auVar91,ZEXT816(0));
            auVar131 = minps(auVar131,auVar130);
            auVar137._0_4_ = fVar141 * auVar131._0_4_;
            auVar137._4_4_ = fVar145 * auVar131._4_4_;
            auVar137._8_4_ = auVar137._8_4_ * auVar131._8_4_;
            auVar137._12_4_ = auVar137._12_4_ * auVar131._12_4_;
          }
          *(undefined1 (*) [16])((long)top_blob->data + uVar22 * 0x10) = auVar137;
          uVar22 = uVar22 + 1;
          lVar33 = lVar33 + lVar24;
          lVar31 = lVar31 + lVar24;
          lVar30 = lVar30 + lVar24;
          lVar26 = lVar26 + lVar24;
        } while (uVar22 != (uint)((int)uVar9 >> 2));
      }
      uVar22 = (long)(int)uVar9 & 0xfffffffffffffffc;
      iVar19 = 0;
      if ((uint)uVar22 == uVar9) goto LAB_002b071b;
      pfVar35 = (float *)(this->super_InnerProduct).activation_params.data;
      pvVar12 = (this->weight_data_tm).data;
      pvVar14 = top_blob->data;
      local_138 = uVar34 & 0xfffffffc;
      do {
        fVar38 = 0.0;
        if (pvVar11 != (void *)0x0) {
          fVar38 = *(float *)((long)pvVar11 + uVar22 * 4);
        }
        pfVar37 = (float *)((long)pvVar12 + uVar22 * lVar36 * 4);
        pfVar23 = pfVar27;
        if ((int)uVar34 < 4) {
          fVar45 = 0.0;
          fVar46 = 0.0;
          fVar47 = 0.0;
          fVar141 = 0.0;
          uVar32 = 0;
        }
        else {
          fVar45 = 0.0;
          fVar46 = 0.0;
          fVar47 = 0.0;
          fVar141 = 0.0;
          iVar19 = 3;
          do {
            fVar45 = fVar45 + *pfVar37 * *pfVar23;
            fVar46 = fVar46 + pfVar37[1] * pfVar23[1];
            fVar47 = fVar47 + pfVar37[2] * pfVar23[2];
            fVar141 = fVar141 + pfVar37[3] * pfVar23[3];
            pfVar23 = pfVar23 + 4;
            pfVar37 = pfVar37 + 4;
            iVar19 = iVar19 + 4;
            uVar32 = local_138;
          } while (iVar19 < (int)uVar34);
        }
        if (uVar34 - uVar32 != 0 && (int)uVar32 <= (int)uVar34) {
          lVar26 = 0;
          do {
            fVar38 = fVar38 + pfVar37[lVar26] * pfVar23[lVar26];
            lVar26 = lVar26 + 1;
          } while (uVar34 - uVar32 != (int)lVar26);
        }
        fVar38 = fVar141 + fVar46 + fVar47 + fVar45 + fVar38;
        fVar45 = fVar38;
        switch(iVar10) {
        case 1:
          if (fVar38 <= 0.0) {
            fVar45 = 0.0;
          }
          break;
        case 2:
          fVar45 = (float)(~-(uint)(0.0 < fVar38) & (uint)*pfVar35 |
                          -(uint)(0.0 < fVar38) & 0x3f800000) * fVar38;
          break;
        case 3:
          if (fVar38 <= *pfVar35) {
            fVar38 = *pfVar35;
          }
          fVar45 = pfVar35[1];
          if (fVar38 <= pfVar35[1]) {
            fVar45 = fVar38;
          }
          break;
        case 4:
          if (88.37626 <= fVar38) {
            fVar38 = 88.37626;
          }
          fVar38 = expf((float)(-(uint)(fVar38 < -88.37626) & 0x42b0c0a5 |
                               ~-(uint)(fVar38 < -88.37626) & (uint)-fVar38));
          fVar45 = 1.0 / (fVar38 + 1.0);
          break;
        case 5:
          fVar45 = expf(fVar38);
          fVar45 = logf(fVar45 + 1.0);
          fVar45 = tanhf(fVar45);
          fVar45 = fVar45 * fVar38;
          break;
        case 6:
          fVar46 = *pfVar35;
          fVar47 = -pfVar35[1] / fVar46;
          fVar45 = 0.0;
          if ((fVar47 <= fVar38) && (fVar45 = fVar38, fVar38 <= fVar47 + 1.0 / fVar46)) {
            fVar45 = (fVar46 * fVar38 + pfVar35[1]) * fVar38;
          }
        }
        *(float *)((long)pvVar14 + uVar22 * 4) = fVar45;
        uVar22 = uVar22 + 1;
      } while ((long)uVar22 < (long)(int)uVar9);
    }
    else {
      iVar19 = 0;
      if ((top_blob->elempack != 4) || (iVar19 = 0, (int)uVar9 < 1)) goto LAB_002b071b;
      uVar22 = 0;
      do {
        fVar141 = 0.0;
        fVar145 = 0.0;
        fVar146 = 0.0;
        fVar147 = 0.0;
        if (pvVar11 != (void *)0x0) {
          pfVar27 = (float *)((long)pvVar11 + uVar22 * 0x10);
          fVar141 = *pfVar27;
          fVar145 = pfVar27[1];
          fVar146 = pfVar27[2];
          fVar147 = pfVar27[3];
        }
        pfVar35 = (float *)((long)(this->weight_data_tm).w * uVar22 *
                            (this->weight_data_tm).elemsize + (long)(this->weight_data_tm).data);
        pfVar27 = local_d0;
        if ((int)uVar34 < 4) {
          fVar148 = 0.0;
          fVar149 = 0.0;
          fVar150 = 0.0;
          fVar151 = 0.0;
          fVar126 = 0.0;
          fVar138 = 0.0;
          fVar139 = 0.0;
          fVar140 = 0.0;
          fVar152 = 0.0;
          fVar154 = 0.0;
          fVar156 = 0.0;
          fVar158 = 0.0;
          uVar32 = 0;
        }
        else {
          fVar152 = 0.0;
          fVar154 = 0.0;
          fVar156 = 0.0;
          fVar158 = 0.0;
          iVar19 = 3;
          fVar126 = 0.0;
          fVar138 = 0.0;
          fVar139 = 0.0;
          fVar140 = 0.0;
          fVar148 = 0.0;
          fVar149 = 0.0;
          fVar150 = 0.0;
          fVar151 = 0.0;
          do {
            fVar153 = *pfVar27;
            fVar155 = pfVar27[1];
            fVar157 = pfVar27[2];
            fVar159 = pfVar27[3];
            fVar141 = fVar141 + *pfVar35 * fVar153;
            fVar145 = fVar145 + pfVar35[1] * fVar153;
            fVar146 = fVar146 + pfVar35[2] * fVar153;
            fVar147 = fVar147 + pfVar35[3] * fVar153;
            fVar152 = fVar152 + pfVar35[4] * fVar155;
            fVar154 = fVar154 + pfVar35[5] * fVar155;
            fVar156 = fVar156 + pfVar35[6] * fVar155;
            fVar158 = fVar158 + pfVar35[7] * fVar155;
            fVar126 = fVar126 + pfVar35[8] * fVar157;
            fVar138 = fVar138 + pfVar35[9] * fVar157;
            fVar139 = fVar139 + pfVar35[10] * fVar157;
            fVar140 = fVar140 + pfVar35[0xb] * fVar157;
            fVar148 = fVar148 + pfVar35[0xc] * fVar159;
            fVar149 = fVar149 + pfVar35[0xd] * fVar159;
            fVar150 = fVar150 + pfVar35[0xe] * fVar159;
            fVar151 = fVar151 + pfVar35[0xf] * fVar159;
            pfVar27 = pfVar27 + 4;
            pfVar35 = pfVar35 + 0x10;
            iVar19 = iVar19 + 4;
            uVar32 = uVar34 & 0xfffffffc;
          } while (iVar19 < (int)uVar34);
        }
        if (uVar34 - uVar32 != 0 && (int)uVar32 <= (int)uVar34) {
          lVar36 = 0;
          do {
            fVar153 = pfVar27[lVar36];
            fVar141 = fVar141 + *pfVar35 * fVar153;
            fVar145 = fVar145 + pfVar35[1] * fVar153;
            fVar146 = fVar146 + pfVar35[2] * fVar153;
            fVar147 = fVar147 + pfVar35[3] * fVar153;
            pfVar35 = pfVar35 + 4;
            lVar36 = lVar36 + 1;
          } while (uVar34 - uVar32 != (int)lVar36);
        }
        fVar141 = fVar126 + fVar148 + fVar152 + fVar141;
        fVar145 = fVar138 + fVar149 + fVar154 + fVar145;
        auVar135._0_8_ = CONCAT44(fVar145,fVar141);
        auVar135._8_4_ = fVar139 + fVar150 + fVar156 + fVar146;
        auVar135._12_4_ = fVar140 + fVar151 + fVar158 + fVar147;
        switch(iVar10) {
        case 1:
          auVar135 = maxps(auVar135,ZEXT816(0));
          break;
        case 2:
          auVar83._8_4_ = auVar135._8_4_;
          auVar83._0_8_ = auVar135._0_8_;
          auVar83._12_4_ = auVar135._12_4_;
          auVar131 = maxps(auVar83,ZEXT816(0));
          auVar65 = minps(auVar135,ZEXT816(0));
          fVar141 = *(this->super_InnerProduct).activation_params.data;
          auVar135._4_4_ = fVar141 * auVar65._4_4_ + auVar131._4_4_;
          auVar135._0_4_ = fVar141 * auVar65._0_4_ + auVar131._0_4_;
          auVar135._8_4_ = fVar141 * auVar65._8_4_ + auVar131._8_4_;
          auVar135._12_4_ = fVar141 * auVar65._12_4_ + auVar131._12_4_;
          break;
        case 3:
          puVar13 = (undefined4 *)(this->super_InnerProduct).activation_params.data;
          uVar7 = *puVar13;
          uVar6 = puVar13[1];
          auVar82._4_4_ = uVar7;
          auVar82._0_4_ = uVar7;
          auVar82._8_4_ = uVar7;
          auVar82._12_4_ = uVar7;
          auVar98._4_4_ = uVar6;
          auVar98._0_4_ = uVar6;
          auVar98._8_4_ = uVar6;
          auVar98._12_4_ = uVar6;
          auVar131 = maxps(auVar135,auVar82);
          auVar135 = minps(auVar131,auVar98);
          break;
        case 4:
          auVar134._0_8_ = CONCAT44(fVar145,fVar141) ^ 0x8000000080000000;
          auVar134._8_4_ = -auVar135._8_4_;
          auVar134._12_4_ = -auVar135._12_4_;
          auVar131 = minps(auVar134,_DAT_005a59e0);
          auVar131 = maxps(auVar131,_DAT_005a59f0);
          fVar145 = auVar131._0_4_ * 1.442695 + 0.5;
          fVar147 = auVar131._4_4_ * 1.442695 + 0.5;
          fVar138 = auVar131._8_4_ * 1.442695 + 0.5;
          fVar140 = auVar131._12_4_ * 1.442695 + 0.5;
          fVar141 = (float)(int)fVar145;
          fVar146 = (float)(int)fVar147;
          fVar126 = (float)(int)fVar138;
          fVar139 = (float)(int)fVar140;
          fVar141 = fVar141 - (float)(-(uint)(fVar145 < fVar141) & (uint)fVar38);
          fVar146 = fVar146 - (float)(-(uint)(fVar147 < fVar146) & (uint)fVar45);
          fVar126 = fVar126 - (float)(-(uint)(fVar138 < fVar126) & (uint)fVar46);
          fVar139 = fVar139 - (float)(-(uint)(fVar140 < fVar139) & (uint)fVar47);
          fVar145 = fVar141 * -0.6931472 + auVar131._0_4_;
          fVar147 = fVar146 * -0.6931472 + auVar131._4_4_;
          fVar138 = fVar126 * -0.6931472 + auVar131._8_4_;
          fVar140 = fVar139 * -0.6931472 + auVar131._12_4_;
          auVar99._0_4_ =
               (float)((int)fVar141 * 0x800000 + (int)fVar38) *
               (fVar145 + fVar38 +
               (((((fVar145 * 0.00019875691 + 0.0013981999) * fVar145 + 0.008333452) * fVar145 +
                 0.041665796) * fVar145 + 0.16666666) * fVar145 + 0.5) * fVar145 * fVar145) + fVar38
          ;
          auVar99._4_4_ =
               (float)((int)fVar146 * 0x800000 + (int)fVar45) *
               (fVar147 + fVar45 +
               (((((fVar147 * 0.00019875691 + 0.0013981999) * fVar147 + 0.008333452) * fVar147 +
                 0.041665796) * fVar147 + 0.16666666) * fVar147 + 0.5) * fVar147 * fVar147) + fVar45
          ;
          auVar99._8_4_ =
               (float)((int)fVar126 * 0x800000 + (int)fVar46) *
               (fVar138 + fVar46 +
               (((((fVar138 * 0.00019875691 + 0.0013981999) * fVar138 + 0.008333452) * fVar138 +
                 0.041665796) * fVar138 + 0.16666666) * fVar138 + 0.5) * fVar138 * fVar138) + fVar46
          ;
          auVar99._12_4_ =
               (float)((int)fVar139 * 0x800000 + (int)fVar47) *
               (fVar140 + fVar47 +
               (((((fVar140 * 0.00019875691 + 0.0013981999) * fVar140 + 0.008333452) * fVar140 +
                 0.041665796) * fVar140 + 0.16666666) * fVar140 + 0.5) * fVar140 * fVar140) + fVar47
          ;
          auVar135 = divps(auVar130,auVar99);
          break;
        case 5:
          auVar80._8_4_ = auVar135._8_4_;
          auVar80._0_8_ = auVar135._0_8_;
          auVar80._12_4_ = auVar135._12_4_;
          auVar131 = minps(auVar80,_DAT_005a59e0);
          auVar131 = maxps(auVar131,_DAT_005a59f0);
          fVar146 = auVar131._0_4_ * 1.442695 + 0.5;
          fVar147 = auVar131._4_4_ * 1.442695 + 0.5;
          fVar126 = auVar131._8_4_ * 1.442695 + 0.5;
          fVar138 = auVar131._12_4_ * 1.442695 + 0.5;
          fVar139 = (float)(int)fVar146;
          fVar140 = (float)(int)fVar147;
          fVar148 = (float)(int)fVar126;
          fVar149 = (float)(int)fVar138;
          fVar139 = fVar139 - (float)(-(uint)(fVar146 < fVar139) & (uint)fVar38);
          fVar140 = fVar140 - (float)(-(uint)(fVar147 < fVar140) & (uint)fVar45);
          fVar148 = fVar148 - (float)(-(uint)(fVar126 < fVar148) & (uint)fVar46);
          fVar149 = fVar149 - (float)(-(uint)(fVar138 < fVar149) & (uint)fVar47);
          fVar146 = auVar131._0_4_ - fVar139 * 0.6931472;
          fVar147 = auVar131._4_4_ - fVar140 * 0.6931472;
          fVar126 = auVar131._8_4_ - fVar148 * 0.6931472;
          fVar138 = auVar131._12_4_ - fVar149 * 0.6931472;
          auVar142._0_4_ =
               (float)((int)fVar139 * 0x800000 + (int)fVar38) *
               (fVar146 + fVar38 +
               (((((fVar146 * 0.00019875691 + 0.0013981999) * fVar146 + 0.008333452) * fVar146 +
                 0.041665796) * fVar146 + 0.16666666) * fVar146 + 0.5) * fVar146 * fVar146) + fVar38
          ;
          auVar142._4_4_ =
               (float)((int)fVar140 * 0x800000 + (int)fVar45) *
               (fVar147 + fVar45 +
               (((((fVar147 * 0.00019875691 + 0.0013981999) * fVar147 + 0.008333452) * fVar147 +
                 0.041665796) * fVar147 + 0.16666666) * fVar147 + 0.5) * fVar147 * fVar147) + fVar45
          ;
          auVar142._8_4_ =
               (float)((int)fVar148 * 0x800000 + (int)fVar46) *
               (fVar126 + fVar46 +
               (((((fVar126 * 0.00019875691 + 0.0013981999) * fVar126 + 0.008333452) * fVar126 +
                 0.041665796) * fVar126 + 0.16666666) * fVar126 + 0.5) * fVar126 * fVar126) + fVar46
          ;
          auVar142._12_4_ =
               (float)((int)fVar149 * 0x800000 + (int)fVar47) *
               (fVar138 + fVar47 +
               (((((fVar138 * 0.00019875691 + 0.0013981999) * fVar138 + 0.008333452) * fVar138 +
                 0.041665796) * fVar138 + 0.16666666) * fVar138 + 0.5) * fVar138 * fVar138) + fVar47
          ;
          auVar131 = maxps(auVar142,_DAT_005a5a80);
          fVar146 = (float)(auVar131._0_4_ & 0x807fffff | 0x3f000000);
          fVar126 = (float)(auVar131._4_4_ & 0x807fffff | 0x3f000000);
          fVar139 = (float)(auVar131._8_4_ & 0x807fffff | 0x3f000000);
          fVar148 = (float)(auVar131._12_4_ & 0x807fffff | 0x3f000000);
          fVar147 = fVar146 + -1.0 + (float)(-(uint)(fVar146 < 0.70710677) & (uint)fVar146);
          fVar138 = fVar126 + -1.0 + (float)(-(uint)(fVar126 < 0.70710677) & (uint)fVar126);
          fVar140 = fVar139 + -1.0 + (float)(-(uint)(fVar139 < 0.70710677) & (uint)fVar139);
          fVar149 = fVar148 + -1.0 + (float)(-(uint)(fVar148 < 0.70710677) & (uint)fVar148);
          auVar96._0_4_ =
               ~-(uint)(auVar142._0_4_ <= 0.0) &
               (uint)((((float)(int)((auVar131._0_4_ >> 0x17) - 0x7e) -
                       (float)(-(uint)(fVar146 < 0.70710677) & (uint)fVar38)) * 0.6931472 + fVar147
                      + (((((((((fVar147 * 0.070376836 + -0.1151461) * fVar147 + 0.116769984) *
                               fVar147 + -0.12420141) * fVar147 + 0.14249323) * fVar147 +
                            -0.16668057) * fVar147 + 0.20000714) * fVar147 + -0.24999994) * fVar147
                         + 0.3333333) * fVar147 + -0.5) * fVar147 * fVar147) * -2.0);
          auVar96._4_4_ =
               ~-(uint)(auVar142._4_4_ <= 0.0) &
               (uint)((((float)(int)((auVar131._4_4_ >> 0x17) - 0x7e) -
                       (float)(-(uint)(fVar126 < 0.70710677) & (uint)fVar45)) * 0.6931472 + fVar138
                      + (((((((((fVar138 * 0.070376836 + -0.1151461) * fVar138 + 0.116769984) *
                               fVar138 + -0.12420141) * fVar138 + 0.14249323) * fVar138 +
                            -0.16668057) * fVar138 + 0.20000714) * fVar138 + -0.24999994) * fVar138
                         + 0.3333333) * fVar138 + -0.5) * fVar138 * fVar138) * -2.0);
          auVar96._8_4_ =
               ~-(uint)(auVar142._8_4_ <= 0.0) &
               (uint)((((float)(int)((auVar131._8_4_ >> 0x17) - 0x7e) -
                       (float)(-(uint)(fVar139 < 0.70710677) & (uint)fVar46)) * 0.6931472 + fVar140
                      + (((((((((fVar140 * 0.070376836 + -0.1151461) * fVar140 + 0.116769984) *
                               fVar140 + -0.12420141) * fVar140 + 0.14249323) * fVar140 +
                            -0.16668057) * fVar140 + 0.20000714) * fVar140 + -0.24999994) * fVar140
                         + 0.3333333) * fVar140 + -0.5) * fVar140 * fVar140) * -2.0);
          auVar96._12_4_ =
               ~-(uint)(auVar142._12_4_ <= 0.0) &
               (uint)((((float)(int)((auVar131._12_4_ >> 0x17) - 0x7e) -
                       (float)(-(uint)(fVar148 < 0.70710677) & (uint)fVar47)) * 0.6931472 + fVar149
                      + (((((((((fVar149 * 0.070376836 + -0.1151461) * fVar149 + 0.116769984) *
                               fVar149 + -0.12420141) * fVar149 + 0.14249323) * fVar149 +
                            -0.16668057) * fVar149 + 0.20000714) * fVar149 + -0.24999994) * fVar149
                         + 0.3333333) * fVar149 + -0.5) * fVar149 * fVar149) * -2.0);
          auVar81._0_8_ =
               CONCAT44(-(uint)(auVar142._4_4_ <= 0.0),-(uint)(auVar142._0_4_ <= 0.0)) &
               0x7fffffff7fffffff;
          auVar81._8_4_ = -(uint)(auVar142._8_4_ <= 0.0) & 0x7fffffff;
          auVar81._12_4_ = -(uint)(auVar142._12_4_ <= 0.0) & 0x7fffffff;
          auVar131 = minps(auVar81 | auVar96,_DAT_005a59e0);
          auVar131 = maxps(auVar131,_DAT_005a59f0);
          fVar146 = auVar131._0_4_ * 1.442695 + 0.5;
          fVar147 = auVar131._4_4_ * 1.442695 + 0.5;
          fVar126 = auVar131._8_4_ * 1.442695 + 0.5;
          fVar138 = auVar131._12_4_ * 1.442695 + 0.5;
          fVar139 = (float)(int)fVar146;
          fVar140 = (float)(int)fVar147;
          fVar148 = (float)(int)fVar126;
          fVar149 = (float)(int)fVar138;
          fVar139 = fVar139 - (float)(-(uint)(fVar146 < fVar139) & (uint)fVar38);
          fVar140 = fVar140 - (float)(-(uint)(fVar147 < fVar140) & (uint)fVar45);
          fVar148 = fVar148 - (float)(-(uint)(fVar126 < fVar148) & (uint)fVar46);
          fVar149 = fVar149 - (float)(-(uint)(fVar138 < fVar149) & (uint)fVar47);
          fVar146 = auVar131._0_4_ - fVar139 * 0.6931472;
          fVar147 = auVar131._4_4_ - fVar140 * 0.6931472;
          fVar126 = auVar131._8_4_ - fVar148 * 0.6931472;
          fVar138 = auVar131._12_4_ - fVar149 * 0.6931472;
          auVar97._0_4_ =
               (float)((int)fVar139 * 0x800000 + (int)fVar38) *
               (fVar146 + fVar38 +
               (((((fVar146 * 0.00019875691 + 0.0013981999) * fVar146 + 0.008333452) * fVar146 +
                 0.041665796) * fVar146 + 0.16666666) * fVar146 + 0.5) * fVar146 * fVar146) + fVar38
          ;
          auVar97._4_4_ =
               (float)((int)fVar140 * 0x800000 + (int)fVar45) *
               (fVar147 + fVar45 +
               (((((fVar147 * 0.00019875691 + 0.0013981999) * fVar147 + 0.008333452) * fVar147 +
                 0.041665796) * fVar147 + 0.16666666) * fVar147 + 0.5) * fVar147 * fVar147) + fVar45
          ;
          auVar97._8_4_ =
               (float)((int)fVar148 * 0x800000 + (int)fVar46) *
               (fVar126 + fVar46 +
               (((((fVar126 * 0.00019875691 + 0.0013981999) * fVar126 + 0.008333452) * fVar126 +
                 0.041665796) * fVar126 + 0.16666666) * fVar126 + 0.5) * fVar126 * fVar126) + fVar46
          ;
          auVar97._12_4_ =
               (float)((int)fVar149 * 0x800000 + (int)fVar47) *
               (fVar138 + fVar47 +
               (((((fVar138 * 0.00019875691 + 0.0013981999) * fVar138 + 0.008333452) * fVar138 +
                 0.041665796) * fVar138 + 0.16666666) * fVar138 + 0.5) * fVar138 * fVar138) + fVar47
          ;
          auVar131 = divps(_DAT_005a66a0,auVar97);
          auVar85._0_4_ = auVar131._0_4_ + -1.0;
          auVar85._4_4_ = auVar131._4_4_ + -1.0;
          auVar85._8_4_ = auVar131._8_4_ + -1.0;
          auVar85._12_4_ = auVar131._12_4_ + -1.0;
          goto LAB_002afefb;
        case 6:
          pfVar27 = (float *)(this->super_InnerProduct).activation_params.data;
          fVar146 = *pfVar27;
          fVar147 = pfVar27[1];
          auVar84._0_4_ = fVar146 * fVar141 + fVar147;
          auVar84._4_4_ = fVar146 * fVar145 + fVar147;
          auVar84._8_4_ = fVar146 * auVar135._8_4_ + fVar147;
          auVar84._12_4_ = fVar146 * auVar135._12_4_ + fVar147;
          auVar131 = maxps(auVar84,ZEXT816(0));
          auVar85 = minps(auVar131,auVar130);
LAB_002afefb:
          auVar135._0_4_ = fVar141 * auVar85._0_4_;
          auVar135._4_4_ = fVar145 * auVar85._4_4_;
          auVar135._8_4_ = auVar135._8_4_ * auVar85._8_4_;
          auVar135._12_4_ = auVar135._12_4_ * auVar85._12_4_;
        }
        *(undefined1 (*) [16])((long)top_blob->data + uVar22 * 0x10) = auVar135;
        uVar22 = uVar22 + 1;
      } while (uVar22 != uVar9);
    }
    iVar19 = 0;
  }
LAB_002b071b:
  if (local_c8 != (int *)0x0) {
    LOCK();
    *local_c8 = *local_c8 + -1;
    UNLOCK();
    if (*local_c8 == 0) {
      if (local_b0 == (Allocator *)0x0) {
        if (local_d0 != (float *)0x0) {
          free(local_d0);
        }
      }
      else {
        (*local_b0->_vptr_Allocator[3])();
      }
    }
  }
  return iVar19;
}

Assistant:

int InnerProduct_x86::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
#if NCNN_INT8
    if (opt.use_int8_inference && int8_scale_term)
    {
        return forward_int8_x86(bottom_blob, top_blob, opt);
    }
#endif

#if NCNN_F16C && __AVX__
    if (cpu_support_x86_f16c() && opt.use_fp16_storage)
    {
        return forward_fp16s(bottom_blob, top_blob, opt);
    }
#endif

    const int num_input = weight_data_size / num_output;

    if (bottom_blob.dims == 2 && bottom_blob.w == num_input)
    {
        // gemm
        int h = bottom_blob.h;
        size_t elemsize = bottom_blob.elemsize;
        int elempack = bottom_blob.elempack;

        top_blob.create(num_output, h, elemsize, elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        innerproduct_gemm_sse(bottom_blob, top_blob, weight_data_tm, bias_data, activation_type, activation_params, opt);

        return 0;
    }

    // flatten
    Mat bottom_blob_flattened = bottom_blob;
    if (bottom_blob.dims != 1)
    {
        Option opt_flatten = opt;
        opt_flatten.blob_allocator = opt.workspace_allocator;

        flatten->forward(bottom_blob, bottom_blob_flattened, opt_flatten);
        if (bottom_blob_flattened.empty())
            return -100;
    }

    size_t elemsize = bottom_blob_flattened.elemsize;
    int elempack = bottom_blob_flattened.elempack;

    int out_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
#if __AVX512F__
        out_elempack = num_output % 16 == 0 ? 16 : num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#elif __AVX__
        out_elempack = num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#else
        out_elempack = num_output % 4 == 0 ? 4 : 1;
#endif
    }
#endif // __SSE2__
    size_t out_elemsize = elemsize / elempack * out_elempack;

    top_blob.create(num_output / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    innerproduct_sse(bottom_blob_flattened, top_blob, weight_data_tm, bias_data, activation_type, activation_params, opt);

    return 0;
}